

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx2::CurveNiIntersector1<8>::
     occluded_t<embree::avx2::RibbonCurve1Intersector1<embree::BezierCurveT,8>,embree::avx2::Occluded1EpilogMU<8,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [28];
  float *pfVar6;
  float *pfVar7;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar9;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  Primitive PVar19;
  int iVar20;
  Geometry *pGVar21;
  __int_type_conflict _Var22;
  RTCFilterFunctionN p_Var23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  long lVar27;
  long lVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [28];
  undefined1 auVar95 [28];
  byte bVar96;
  uint uVar97;
  ulong uVar98;
  ulong uVar99;
  ulong uVar100;
  undefined1 auVar101 [8];
  ulong uVar102;
  Geometry *geometry;
  long lVar103;
  undefined4 uVar104;
  float fVar117;
  undefined8 uVar105;
  undefined1 auVar106 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined8 uVar118;
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [64];
  undefined1 auVar130 [16];
  float fVar129;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar131 [16];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [64];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  float fVar159;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  float fVar157;
  float fVar158;
  float fVar160;
  float fVar161;
  float fVar162;
  undefined1 auVar156 [64];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [64];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [64];
  float fVar179;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [64];
  undefined1 auVar191 [16];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 in_ZMM10 [64];
  undefined4 uVar194;
  undefined1 auVar195 [16];
  float fVar196;
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  float fVar202;
  undefined1 in_ZMM12 [64];
  undefined1 auVar200 [64];
  undefined1 auVar201 [64];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [64];
  undefined1 auVar206 [64];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  float fVar210;
  undefined1 auVar209 [64];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CubicBezierCurve<embree::Vec3fx>,_8> bhit;
  bool local_7b5;
  int local_7b4;
  RayQueryContext *local_7b0;
  Ray *local_7a8;
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  undefined1 local_780 [32];
  undefined1 local_760 [48];
  Precalculations *local_730;
  ulong local_728;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined8 local_6a0;
  undefined8 uStack_698;
  RTCFilterFunctionNArguments local_690;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined8 local_5e0;
  undefined4 local_5d8;
  float local_5d4;
  undefined4 local_5d0;
  undefined4 local_5cc;
  undefined4 local_5c8;
  uint local_5c4;
  uint local_5c0;
  ulong local_5a8;
  undefined1 local_5a0 [32];
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [8];
  undefined8 uStack_558;
  undefined1 local_540 [32];
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [32];
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  int iStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined4 local_330;
  undefined4 uStack_32c;
  undefined4 uStack_328;
  undefined4 uStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  int local_2c0;
  int local_2bc;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined1 local_260 [32];
  float local_240 [4];
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [32];
  undefined1 local_180 [8];
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  undefined1 local_160 [32];
  float local_140;
  float fStack_13c;
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  undefined4 local_120;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar19 = prim[1];
  uVar102 = (ulong)(byte)PVar19;
  fVar129 = *(float *)(prim + uVar102 * 0x19 + 0x12);
  auVar24 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar102 * 0x19 + 6));
  auVar163._0_4_ = fVar129 * (ray->dir).field_0.m128[0];
  auVar163._4_4_ = fVar129 * (ray->dir).field_0.m128[1];
  auVar163._8_4_ = fVar129 * (ray->dir).field_0.m128[2];
  auVar163._12_4_ = fVar129 * (ray->dir).field_0.m128[3];
  auVar106._0_4_ = fVar129 * auVar24._0_4_;
  auVar106._4_4_ = fVar129 * auVar24._4_4_;
  auVar106._8_4_ = fVar129 * auVar24._8_4_;
  auVar106._12_4_ = fVar129 * auVar24._12_4_;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar102 * 4 + 6);
  auVar148 = vpmovsxbd_avx2(auVar24);
  auVar148 = vcvtdq2ps_avx(auVar148);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar102 * 5 + 6);
  auVar25 = vpmovsxbd_avx2(auVar11);
  auVar25 = vcvtdq2ps_avx(auVar25);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar102 * 6 + 6);
  auVar170 = vpmovsxbd_avx2(auVar12);
  auVar170 = vcvtdq2ps_avx(auVar170);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar102 * 0xb + 6);
  auVar114 = vpmovsxbd_avx2(auVar13);
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar19 * 0xc) + 6);
  auVar125 = vpmovsxbd_avx2(auVar14);
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + (uint)(byte)PVar19 * 0xc + uVar102 + 6);
  auVar183 = vpmovsxbd_avx2(auVar15);
  auVar183 = vcvtdq2ps_avx(auVar183);
  uVar98 = (ulong)(uint)((int)(uVar102 * 9) * 2);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar98 + 6);
  auVar26 = vpmovsxbd_avx2(auVar16);
  auVar26 = vcvtdq2ps_avx(auVar26);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar98 + uVar102 + 6);
  auVar116 = vpmovsxbd_avx2(auVar17);
  auVar116 = vcvtdq2ps_avx(auVar116);
  uVar98 = (ulong)(uint)((int)(uVar102 * 5) << 2);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar98 + 6);
  auVar119 = vpmovsxbd_avx2(auVar18);
  auVar119 = vcvtdq2ps_avx(auVar119);
  auVar203._4_4_ = auVar163._0_4_;
  auVar203._0_4_ = auVar163._0_4_;
  auVar203._8_4_ = auVar163._0_4_;
  auVar203._12_4_ = auVar163._0_4_;
  auVar203._16_4_ = auVar163._0_4_;
  auVar203._20_4_ = auVar163._0_4_;
  auVar203._24_4_ = auVar163._0_4_;
  auVar203._28_4_ = auVar163._0_4_;
  auVar24 = vmovshdup_avx(auVar163);
  uVar105 = auVar24._0_8_;
  auVar211._8_8_ = uVar105;
  auVar211._0_8_ = uVar105;
  auVar211._16_8_ = uVar105;
  auVar211._24_8_ = uVar105;
  auVar24 = vshufps_avx(auVar163,auVar163,0xaa);
  fVar129 = auVar24._0_4_;
  auVar156._0_4_ = fVar129 * auVar170._0_4_;
  fVar117 = auVar24._4_4_;
  auVar156._4_4_ = fVar117 * auVar170._4_4_;
  auVar156._8_4_ = fVar129 * auVar170._8_4_;
  auVar156._12_4_ = fVar117 * auVar170._12_4_;
  auVar156._16_4_ = fVar129 * auVar170._16_4_;
  auVar156._20_4_ = fVar117 * auVar170._20_4_;
  auVar156._28_36_ = in_ZMM12._28_36_;
  auVar156._24_4_ = fVar129 * auVar170._24_4_;
  auVar174._0_4_ = auVar183._0_4_ * fVar129;
  auVar174._4_4_ = auVar183._4_4_ * fVar117;
  auVar174._8_4_ = auVar183._8_4_ * fVar129;
  auVar174._12_4_ = auVar183._12_4_ * fVar117;
  auVar174._16_4_ = auVar183._16_4_ * fVar129;
  auVar174._20_4_ = auVar183._20_4_ * fVar117;
  auVar174._28_36_ = in_ZMM10._28_36_;
  auVar174._24_4_ = auVar183._24_4_ * fVar129;
  auVar175._0_4_ = auVar119._0_4_ * fVar129;
  auVar175._4_4_ = auVar119._4_4_ * fVar117;
  auVar175._8_4_ = auVar119._8_4_ * fVar129;
  auVar175._12_4_ = auVar119._12_4_ * fVar117;
  auVar175._16_4_ = auVar119._16_4_ * fVar129;
  auVar175._20_4_ = auVar119._20_4_ * fVar117;
  auVar175._24_4_ = auVar119._24_4_ * fVar129;
  auVar175._28_4_ = 0;
  auVar24 = vfmadd231ps_fma(auVar156._0_32_,auVar211,auVar25);
  auVar11 = vfmadd231ps_fma(auVar174._0_32_,auVar211,auVar125);
  auVar12 = vfmadd231ps_fma(auVar175,auVar116,auVar211);
  auVar13 = vfmadd231ps_fma(ZEXT1632(auVar24),auVar203,auVar148);
  auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar203,auVar114);
  auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar26,auVar203);
  auVar204._4_4_ = auVar106._0_4_;
  auVar204._0_4_ = auVar106._0_4_;
  auVar204._8_4_ = auVar106._0_4_;
  auVar204._12_4_ = auVar106._0_4_;
  auVar204._16_4_ = auVar106._0_4_;
  auVar204._20_4_ = auVar106._0_4_;
  auVar204._24_4_ = auVar106._0_4_;
  auVar204._28_4_ = auVar106._0_4_;
  auVar24 = vmovshdup_avx(auVar106);
  uVar105 = auVar24._0_8_;
  auVar212._8_8_ = uVar105;
  auVar212._0_8_ = uVar105;
  auVar212._16_8_ = uVar105;
  auVar212._24_8_ = uVar105;
  auVar24 = vshufps_avx(auVar106,auVar106,0xaa);
  fVar129 = auVar24._0_4_;
  auVar120._0_4_ = fVar129 * auVar170._0_4_;
  fVar117 = auVar24._4_4_;
  auVar120._4_4_ = fVar117 * auVar170._4_4_;
  auVar120._8_4_ = fVar129 * auVar170._8_4_;
  auVar120._12_4_ = fVar117 * auVar170._12_4_;
  auVar120._16_4_ = fVar129 * auVar170._16_4_;
  auVar120._20_4_ = fVar117 * auVar170._20_4_;
  auVar120._24_4_ = fVar129 * auVar170._24_4_;
  auVar120._28_4_ = 0;
  auVar138._4_4_ = auVar183._4_4_ * fVar117;
  auVar138._0_4_ = auVar183._0_4_ * fVar129;
  auVar138._8_4_ = auVar183._8_4_ * fVar129;
  auVar138._12_4_ = auVar183._12_4_ * fVar117;
  auVar138._16_4_ = auVar183._16_4_ * fVar129;
  auVar138._20_4_ = auVar183._20_4_ * fVar117;
  auVar138._24_4_ = auVar183._24_4_ * fVar129;
  auVar138._28_4_ = auVar170._28_4_;
  auVar170._4_4_ = auVar119._4_4_ * fVar117;
  auVar170._0_4_ = auVar119._0_4_ * fVar129;
  auVar170._8_4_ = auVar119._8_4_ * fVar129;
  auVar170._12_4_ = auVar119._12_4_ * fVar117;
  auVar170._16_4_ = auVar119._16_4_ * fVar129;
  auVar170._20_4_ = auVar119._20_4_ * fVar117;
  auVar170._24_4_ = auVar119._24_4_ * fVar129;
  auVar170._28_4_ = fVar117;
  auVar24 = vfmadd231ps_fma(auVar120,auVar212,auVar25);
  auVar14 = vfmadd231ps_fma(auVar138,auVar212,auVar125);
  auVar15 = vfmadd231ps_fma(auVar170,auVar212,auVar116);
  auVar16 = vfmadd231ps_fma(ZEXT1632(auVar24),auVar204,auVar148);
  local_1a0._8_4_ = 0x7fffffff;
  local_1a0._0_8_ = 0x7fffffff7fffffff;
  local_1a0._12_4_ = 0x7fffffff;
  local_1a0._16_4_ = 0x7fffffff;
  local_1a0._20_4_ = 0x7fffffff;
  local_1a0._24_4_ = 0x7fffffff;
  local_1a0._28_4_ = 0x7fffffff;
  auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar204,auVar114);
  auVar148 = vandps_avx(ZEXT1632(auVar13),local_1a0);
  auVar135._8_4_ = 0x219392ef;
  auVar135._0_8_ = 0x219392ef219392ef;
  auVar135._12_4_ = 0x219392ef;
  auVar135._16_4_ = 0x219392ef;
  auVar135._20_4_ = 0x219392ef;
  auVar135._24_4_ = 0x219392ef;
  auVar135._28_4_ = 0x219392ef;
  auVar148 = vcmpps_avx(auVar148,auVar135,1);
  auVar25 = vblendvps_avx(ZEXT1632(auVar13),auVar135,auVar148);
  auVar148 = vandps_avx(ZEXT1632(auVar11),local_1a0);
  auVar148 = vcmpps_avx(auVar148,auVar135,1);
  auVar170 = vblendvps_avx(ZEXT1632(auVar11),auVar135,auVar148);
  auVar148 = vandps_avx(ZEXT1632(auVar12),local_1a0);
  auVar148 = vcmpps_avx(auVar148,auVar135,1);
  auVar114 = vrcpps_avx(auVar25);
  auVar148 = vblendvps_avx(ZEXT1632(auVar12),auVar135,auVar148);
  auVar167._8_4_ = 0x3f800000;
  auVar167._0_8_ = &DAT_3f8000003f800000;
  auVar167._12_4_ = 0x3f800000;
  auVar167._16_4_ = 0x3f800000;
  auVar167._20_4_ = 0x3f800000;
  auVar167._24_4_ = 0x3f800000;
  auVar167._28_4_ = 0x3f800000;
  auVar13 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar204,auVar26);
  auVar125 = vrcpps_avx(auVar170);
  auVar24 = vfnmadd213ps_fma(auVar25,auVar114,auVar167);
  auVar24 = vfmadd132ps_fma(ZEXT1632(auVar24),auVar114,auVar114);
  auVar11 = vfnmadd213ps_fma(auVar170,auVar125,auVar167);
  auVar11 = vfmadd132ps_fma(ZEXT1632(auVar11),auVar125,auVar125);
  auVar25 = vrcpps_avx(auVar148);
  auVar12 = vfnmadd213ps_fma(auVar148,auVar25,auVar167);
  auVar148 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar102 * 7 + 6));
  auVar12 = vfmadd132ps_fma(ZEXT1632(auVar12),auVar25,auVar25);
  auVar148 = vcvtdq2ps_avx(auVar148);
  auVar148 = vsubps_avx(auVar148,ZEXT1632(auVar16));
  auVar114._4_4_ = auVar24._4_4_ * auVar148._4_4_;
  auVar114._0_4_ = auVar24._0_4_ * auVar148._0_4_;
  auVar114._8_4_ = auVar24._8_4_ * auVar148._8_4_;
  auVar114._12_4_ = auVar24._12_4_ * auVar148._12_4_;
  auVar114._16_4_ = auVar148._16_4_ * 0.0;
  auVar114._20_4_ = auVar148._20_4_ * 0.0;
  auVar114._24_4_ = auVar148._24_4_ * 0.0;
  auVar114._28_4_ = auVar148._28_4_;
  auVar148 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar102 * 9 + 6));
  auVar148 = vcvtdq2ps_avx(auVar148);
  auVar148 = vsubps_avx(auVar148,ZEXT1632(auVar16));
  auVar108._0_4_ = auVar24._0_4_ * auVar148._0_4_;
  auVar108._4_4_ = auVar24._4_4_ * auVar148._4_4_;
  auVar108._8_4_ = auVar24._8_4_ * auVar148._8_4_;
  auVar108._12_4_ = auVar24._12_4_ * auVar148._12_4_;
  auVar108._16_4_ = auVar148._16_4_ * 0.0;
  auVar108._20_4_ = auVar148._20_4_ * 0.0;
  auVar108._24_4_ = auVar148._24_4_ * 0.0;
  auVar108._28_4_ = 0;
  auVar119._1_3_ = 0;
  auVar119[0] = PVar19;
  auVar25 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar19 * 0x10 + 6));
  auVar148 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar19 * 0x10 + uVar102 * -2 + 6));
  auVar148 = vcvtdq2ps_avx(auVar148);
  auVar148 = vsubps_avx(auVar148,ZEXT1632(auVar14));
  auVar125._4_4_ = auVar148._4_4_ * auVar11._4_4_;
  auVar125._0_4_ = auVar148._0_4_ * auVar11._0_4_;
  auVar125._8_4_ = auVar148._8_4_ * auVar11._8_4_;
  auVar125._12_4_ = auVar148._12_4_ * auVar11._12_4_;
  auVar125._16_4_ = auVar148._16_4_ * 0.0;
  auVar125._20_4_ = auVar148._20_4_ * 0.0;
  auVar125._24_4_ = auVar148._24_4_ * 0.0;
  auVar125._28_4_ = auVar148._28_4_;
  auVar148 = vcvtdq2ps_avx(auVar25);
  auVar148 = vsubps_avx(auVar148,ZEXT1632(auVar14));
  auVar183._4_4_ = auVar11._4_4_ * auVar148._4_4_;
  auVar183._0_4_ = auVar11._0_4_ * auVar148._0_4_;
  auVar183._8_4_ = auVar11._8_4_ * auVar148._8_4_;
  auVar183._12_4_ = auVar11._12_4_ * auVar148._12_4_;
  auVar183._16_4_ = auVar148._16_4_ * 0.0;
  auVar183._20_4_ = auVar148._20_4_ * 0.0;
  auVar183._24_4_ = auVar148._24_4_ * 0.0;
  auVar183._28_4_ = auVar148._28_4_;
  auVar148 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar98 + uVar102 + 6));
  auVar148 = vcvtdq2ps_avx(auVar148);
  auVar148 = vsubps_avx(auVar148,ZEXT1632(auVar13));
  auVar26._4_4_ = auVar148._4_4_ * auVar12._4_4_;
  auVar26._0_4_ = auVar148._0_4_ * auVar12._0_4_;
  auVar26._8_4_ = auVar148._8_4_ * auVar12._8_4_;
  auVar26._12_4_ = auVar148._12_4_ * auVar12._12_4_;
  auVar26._16_4_ = auVar148._16_4_ * 0.0;
  auVar26._20_4_ = auVar148._20_4_ * 0.0;
  auVar26._24_4_ = auVar148._24_4_ * 0.0;
  auVar26._28_4_ = auVar148._28_4_;
  auVar148 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar102 * 0x17 + 6));
  auVar148 = vcvtdq2ps_avx(auVar148);
  auVar148 = vsubps_avx(auVar148,ZEXT1632(auVar13));
  auVar116._4_4_ = auVar12._4_4_ * auVar148._4_4_;
  auVar116._0_4_ = auVar12._0_4_ * auVar148._0_4_;
  auVar116._8_4_ = auVar12._8_4_ * auVar148._8_4_;
  auVar116._12_4_ = auVar12._12_4_ * auVar148._12_4_;
  auVar116._16_4_ = auVar148._16_4_ * 0.0;
  auVar116._20_4_ = auVar148._20_4_ * 0.0;
  auVar116._24_4_ = auVar148._24_4_ * 0.0;
  auVar116._28_4_ = auVar148._28_4_;
  auVar148 = vpminsd_avx2(auVar114,auVar108);
  auVar25 = vpminsd_avx2(auVar125,auVar183);
  auVar148 = vmaxps_avx(auVar148,auVar25);
  auVar25 = vpminsd_avx2(auVar26,auVar116);
  uVar104 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar180._4_4_ = uVar104;
  auVar180._0_4_ = uVar104;
  auVar180._8_4_ = uVar104;
  auVar180._12_4_ = uVar104;
  auVar180._16_4_ = uVar104;
  auVar180._20_4_ = uVar104;
  auVar180._24_4_ = uVar104;
  auVar180._28_4_ = uVar104;
  auVar25 = vmaxps_avx(auVar25,auVar180);
  auVar148 = vmaxps_avx(auVar148,auVar25);
  local_80._4_4_ = auVar148._4_4_ * 0.99999964;
  local_80._0_4_ = auVar148._0_4_ * 0.99999964;
  local_80._8_4_ = auVar148._8_4_ * 0.99999964;
  local_80._12_4_ = auVar148._12_4_ * 0.99999964;
  local_80._16_4_ = auVar148._16_4_ * 0.99999964;
  local_80._20_4_ = auVar148._20_4_ * 0.99999964;
  local_80._24_4_ = auVar148._24_4_ * 0.99999964;
  local_80._28_4_ = 0x3f7ffffa;
  auVar174 = ZEXT3264(local_80);
  auVar148 = vpmaxsd_avx2(auVar114,auVar108);
  auVar25 = vpmaxsd_avx2(auVar125,auVar183);
  auVar148 = vminps_avx(auVar148,auVar25);
  auVar25 = vpmaxsd_avx2(auVar26,auVar116);
  fVar129 = ray->tfar;
  auVar134._4_4_ = fVar129;
  auVar134._0_4_ = fVar129;
  auVar134._8_4_ = fVar129;
  auVar134._12_4_ = fVar129;
  auVar134._16_4_ = fVar129;
  auVar134._20_4_ = fVar129;
  auVar134._24_4_ = fVar129;
  auVar134._28_4_ = fVar129;
  auVar25 = vminps_avx(auVar25,auVar134);
  auVar148 = vminps_avx(auVar148,auVar25);
  auVar25._4_4_ = auVar148._4_4_ * 1.0000004;
  auVar25._0_4_ = auVar148._0_4_ * 1.0000004;
  auVar25._8_4_ = auVar148._8_4_ * 1.0000004;
  auVar25._12_4_ = auVar148._12_4_ * 1.0000004;
  auVar25._16_4_ = auVar148._16_4_ * 1.0000004;
  auVar25._20_4_ = auVar148._20_4_ * 1.0000004;
  auVar25._24_4_ = auVar148._24_4_ * 1.0000004;
  auVar25._28_4_ = auVar148._28_4_;
  auVar119[4] = PVar19;
  auVar119._5_3_ = 0;
  auVar119[8] = PVar19;
  auVar119._9_3_ = 0;
  auVar119[0xc] = PVar19;
  auVar119._13_3_ = 0;
  auVar119[0x10] = PVar19;
  auVar119._17_3_ = 0;
  auVar119[0x14] = PVar19;
  auVar119._21_3_ = 0;
  auVar119[0x18] = PVar19;
  auVar119._25_3_ = 0;
  auVar119[0x1c] = PVar19;
  auVar119._29_3_ = 0;
  auVar148 = vcmpps_avx(local_80,auVar25,2);
  auVar25 = vpcmpgtd_avx2(auVar119,_DAT_0205a920);
  auVar148 = vandps_avx(auVar148,auVar25);
  uVar97 = vmovmskps_avx(auVar148);
  local_7b5 = uVar97 != 0;
  if (local_7b5) {
    uVar97 = uVar97 & 0xff;
    local_460 = mm_lookupmask_ps._16_8_;
    uStack_458 = mm_lookupmask_ps._24_8_;
    uStack_450 = mm_lookupmask_ps._16_8_;
    uStack_448 = mm_lookupmask_ps._24_8_;
    local_330 = 0x7fffffff;
    uStack_32c = 0x7fffffff;
    uStack_328 = 0x7fffffff;
    uStack_324 = 0x7fffffff;
    do {
      auVar148 = local_3c0;
      local_2e0 = auVar174._0_32_;
      lVar27 = 0;
      uVar102 = (ulong)uVar97;
      for (uVar98 = uVar102; (uVar98 & 1) == 0; uVar98 = uVar98 >> 1 | 0x8000000000000000) {
        lVar27 = lVar27 + 1;
      }
      local_728 = (ulong)*(uint *)(prim + 2);
      pGVar21 = (context->scene->geometries).items[*(uint *)(prim + 2)].ptr;
      _Var22 = pGVar21[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      local_5a8 = (ulong)*(uint *)(prim + lVar27 * 4 + 6);
      uVar98 = (ulong)*(uint *)(*(long *)&pGVar21->field_0x58 +
                               _Var22 * *(uint *)(prim + lVar27 * 4 + 6));
      p_Var23 = pGVar21[1].intersectionFilterN;
      lVar27 = *(long *)&pGVar21[1].time_range.upper;
      pauVar1 = (undefined1 (*) [16])(lVar27 + (long)p_Var23 * uVar98);
      local_6a0 = *(undefined8 *)*pauVar1;
      uStack_698 = *(undefined8 *)(*pauVar1 + 8);
      pauVar2 = (undefined1 (*) [16])(lVar27 + (uVar98 + 1) * (long)p_Var23);
      local_4d0 = *(undefined8 *)*pauVar2;
      uStack_4c8 = *(undefined8 *)(*pauVar2 + 8);
      uVar100 = (uVar98 + 2) * (long)p_Var23;
      pauVar3 = (undefined1 (*) [16])(lVar27 + uVar100);
      local_4e0 = *(undefined8 *)*pauVar3;
      uStack_4d8 = *(undefined8 *)(*pauVar3 + 8);
      uVar102 = uVar102 - 1 & uVar102;
      pauVar4 = (undefined1 (*) [16])(lVar27 + (uVar98 + 3) * (long)p_Var23);
      local_4f0 = *(undefined8 *)*pauVar4;
      uStack_4e8 = *(undefined8 *)(*pauVar4 + 8);
      if (uVar102 != 0) {
        uVar99 = uVar102 - 1 & uVar102;
        lVar27 = 0;
        for (uVar98 = uVar102; (uVar98 & 1) == 0; uVar98 = uVar98 >> 1 | 0x8000000000000000) {
          lVar27 = lVar27 + 1;
        }
        uVar100 = (ulong)*(uint *)(*(long *)&pGVar21->field_0x58 +
                                  *(uint *)(prim + lVar27 * 4 + 6) * _Var22) * (long)p_Var23;
        if (uVar99 != 0) {
          for (; (uVar99 & 1) == 0; uVar99 = uVar99 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar20 = (int)pGVar21[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      aVar8 = (ray->org).field_0;
      auVar11 = vsubps_avx(*pauVar1,(undefined1  [16])aVar8);
      uVar104 = auVar11._0_4_;
      auVar146._4_4_ = uVar104;
      auVar146._0_4_ = uVar104;
      auVar146._8_4_ = uVar104;
      auVar146._12_4_ = uVar104;
      auVar24 = vshufps_avx(auVar11,auVar11,0x55);
      auVar11 = vshufps_avx(auVar11,auVar11,0xaa);
      aVar9 = (pre->ray_space).vx.field_0;
      aVar10 = (pre->ray_space).vy.field_0;
      fVar129 = (pre->ray_space).vz.field_0.m128[0];
      fVar117 = (pre->ray_space).vz.field_0.m128[1];
      fVar157 = (pre->ray_space).vz.field_0.m128[2];
      fVar158 = (pre->ray_space).vz.field_0.m128[3];
      auVar164._0_4_ = auVar11._0_4_ * fVar129;
      auVar164._4_4_ = auVar11._4_4_ * fVar117;
      auVar164._8_4_ = auVar11._8_4_ * fVar157;
      auVar164._12_4_ = auVar11._12_4_ * fVar158;
      auVar24 = vfmadd231ps_fma(auVar164,(undefined1  [16])aVar10,auVar24);
      auVar15 = vfmadd231ps_fma(auVar24,(undefined1  [16])aVar9,auVar146);
      auVar24 = vblendps_avx(auVar15,*pauVar1,8);
      auVar12 = vsubps_avx(*pauVar2,(undefined1  [16])aVar8);
      uVar104 = auVar12._0_4_;
      auVar165._4_4_ = uVar104;
      auVar165._0_4_ = uVar104;
      auVar165._8_4_ = uVar104;
      auVar165._12_4_ = uVar104;
      auVar11 = vshufps_avx(auVar12,auVar12,0x55);
      auVar12 = vshufps_avx(auVar12,auVar12,0xaa);
      auVar191._0_4_ = auVar12._0_4_ * fVar129;
      auVar191._4_4_ = auVar12._4_4_ * fVar117;
      auVar191._8_4_ = auVar12._8_4_ * fVar157;
      auVar191._12_4_ = auVar12._12_4_ * fVar158;
      auVar11 = vfmadd231ps_fma(auVar191,(undefined1  [16])aVar10,auVar11);
      auVar16 = vfmadd231ps_fma(auVar11,(undefined1  [16])aVar9,auVar165);
      auVar11 = vblendps_avx(auVar16,*pauVar2,8);
      auVar13 = vsubps_avx(*pauVar3,(undefined1  [16])aVar8);
      uVar104 = auVar13._0_4_;
      auVar172._4_4_ = uVar104;
      auVar172._0_4_ = uVar104;
      auVar172._8_4_ = uVar104;
      auVar172._12_4_ = uVar104;
      auVar12 = vshufps_avx(auVar13,auVar13,0x55);
      auVar13 = vshufps_avx(auVar13,auVar13,0xaa);
      auVar195._0_4_ = auVar13._0_4_ * fVar129;
      auVar195._4_4_ = auVar13._4_4_ * fVar117;
      auVar195._8_4_ = auVar13._8_4_ * fVar157;
      auVar195._12_4_ = auVar13._12_4_ * fVar158;
      auVar12 = vfmadd231ps_fma(auVar195,(undefined1  [16])aVar10,auVar12);
      auVar17 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar9,auVar172);
      auVar12 = vblendps_avx(auVar17,*pauVar3,8);
      auVar14 = vsubps_avx(*pauVar4,(undefined1  [16])aVar8);
      uVar104 = auVar14._0_4_;
      auVar173._4_4_ = uVar104;
      auVar173._0_4_ = uVar104;
      auVar173._8_4_ = uVar104;
      auVar173._12_4_ = uVar104;
      auVar13 = vshufps_avx(auVar14,auVar14,0x55);
      auVar14 = vshufps_avx(auVar14,auVar14,0xaa);
      auVar197._0_4_ = auVar14._0_4_ * fVar129;
      auVar197._4_4_ = auVar14._4_4_ * fVar117;
      auVar197._8_4_ = auVar14._8_4_ * fVar157;
      auVar197._12_4_ = auVar14._12_4_ * fVar158;
      auVar13 = vfmadd231ps_fma(auVar197,(undefined1  [16])aVar10,auVar13);
      auVar18 = vfmadd231ps_fma(auVar13,(undefined1  [16])aVar9,auVar173);
      auVar13 = vblendps_avx(auVar18,*pauVar4,8);
      auVar29._4_4_ = uStack_32c;
      auVar29._0_4_ = local_330;
      auVar29._8_4_ = uStack_328;
      auVar29._12_4_ = uStack_324;
      auVar24 = vandps_avx(auVar24,auVar29);
      auVar11 = vandps_avx(auVar11,auVar29);
      auVar14 = vmaxps_avx(auVar24,auVar11);
      auVar24 = vandps_avx(auVar12,auVar29);
      auVar11 = vandps_avx(auVar13,auVar29);
      auVar24 = vmaxps_avx(auVar24,auVar11);
      auVar24 = vmaxps_avx(auVar14,auVar24);
      auVar11 = vmovshdup_avx(auVar24);
      auVar11 = vmaxss_avx(auVar11,auVar24);
      auVar24 = vshufpd_avx(auVar24,auVar24,1);
      auVar24 = vmaxss_avx(auVar24,auVar11);
      lVar27 = (long)iVar20 * 0x44;
      auVar11 = vmovshdup_avx(auVar15);
      uVar105 = auVar11._0_8_;
      local_3e0._8_8_ = uVar105;
      local_3e0._0_8_ = uVar105;
      local_3e0._16_8_ = uVar105;
      local_3e0._24_8_ = uVar105;
      auVar25 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x484);
      auVar11 = vmovshdup_avx(auVar16);
      uVar105 = auVar11._0_8_;
      local_640._8_8_ = uVar105;
      local_640._0_8_ = uVar105;
      local_640._16_8_ = uVar105;
      local_640._24_8_ = uVar105;
      auVar170 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x908);
      uVar194 = auVar17._0_4_;
      local_6c0._4_4_ = uVar194;
      local_6c0._0_4_ = uVar194;
      local_6c0._8_4_ = uVar194;
      local_6c0._12_4_ = uVar194;
      local_6c0._16_4_ = uVar194;
      local_6c0._20_4_ = uVar194;
      local_6c0._24_4_ = uVar194;
      local_6c0._28_4_ = uVar194;
      auVar11 = vmovshdup_avx(auVar17);
      uVar105 = auVar11._0_8_;
      local_620._8_8_ = uVar105;
      local_620._0_8_ = uVar105;
      local_620._16_8_ = uVar105;
      local_620._24_8_ = uVar105;
      fVar117 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar27 + 0xd8c);
      fVar157 = *(float *)(bezier_basis0 + lVar27 + 0xd90);
      fVar158 = *(float *)(bezier_basis0 + lVar27 + 0xd94);
      fVar159 = *(float *)(bezier_basis0 + lVar27 + 0xd98);
      fVar160 = *(float *)(bezier_basis0 + lVar27 + 0xd9c);
      fVar161 = *(float *)(bezier_basis0 + lVar27 + 0xda0);
      fVar162 = *(float *)(bezier_basis0 + lVar27 + 0xda4);
      auVar94 = *(undefined1 (*) [28])(bezier_basis0 + lVar27 + 0xd8c);
      local_580 = auVar18._0_4_;
      auVar11 = vmovshdup_avx(auVar18);
      uVar105 = auVar11._0_8_;
      auVar166._0_4_ = fVar117 * local_580;
      auVar166._4_4_ = fVar157 * local_580;
      auVar166._8_4_ = fVar158 * local_580;
      auVar166._12_4_ = fVar159 * local_580;
      auVar166._16_4_ = fVar160 * local_580;
      auVar166._20_4_ = fVar161 * local_580;
      auVar166._24_4_ = fVar162 * local_580;
      auVar166._28_4_ = 0;
      local_520 = auVar11._0_4_;
      auVar107._0_4_ = local_520 * fVar117;
      fStack_51c = auVar11._4_4_;
      auVar107._4_4_ = fStack_51c * fVar157;
      auVar107._8_4_ = local_520 * fVar158;
      auVar107._12_4_ = fStack_51c * fVar159;
      auVar107._16_4_ = local_520 * fVar160;
      auVar107._20_4_ = fStack_51c * fVar161;
      auVar107._24_4_ = local_520 * fVar162;
      auVar107._28_4_ = 0;
      auVar11 = vfmadd231ps_fma(auVar166,auVar170,local_6c0);
      auVar12 = vfmadd231ps_fma(auVar107,auVar170,local_620);
      uVar104 = auVar16._0_4_;
      local_720._4_4_ = uVar104;
      local_720._0_4_ = uVar104;
      local_720._8_4_ = uVar104;
      local_720._12_4_ = uVar104;
      local_720._16_4_ = uVar104;
      local_720._20_4_ = uVar104;
      local_720._24_4_ = uVar104;
      local_720._28_4_ = uVar104;
      auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar25,local_720);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar25,local_640);
      auVar114 = *(undefined1 (*) [32])(bezier_basis0 + lVar27);
      uVar104 = auVar15._0_4_;
      local_6e0._4_4_ = uVar104;
      local_6e0._0_4_ = uVar104;
      local_6e0._8_4_ = uVar104;
      local_6e0._12_4_ = uVar104;
      local_6e0._16_4_ = uVar104;
      local_6e0._20_4_ = uVar104;
      local_6e0._24_4_ = uVar104;
      local_6e0._28_4_ = uVar104;
      auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar114,local_6e0);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar114,local_3e0);
      auVar125 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x908);
      fVar196 = *(float *)*(undefined1 (*) [28])(bezier_basis1 + lVar27 + 0xd8c);
      fVar202 = *(float *)(bezier_basis1 + lVar27 + 0xd90);
      fVar86 = *(float *)(bezier_basis1 + lVar27 + 0xd94);
      fVar87 = *(float *)(bezier_basis1 + lVar27 + 0xd98);
      fVar88 = *(float *)(bezier_basis1 + lVar27 + 0xd9c);
      fVar89 = *(float *)(bezier_basis1 + lVar27 + 0xda0);
      fVar179 = *(float *)(bezier_basis1 + lVar27 + 0xda4);
      auVar95 = *(undefined1 (*) [28])(bezier_basis1 + lVar27 + 0xd8c);
      fStack_57c = local_580;
      fStack_578 = local_580;
      fStack_574 = local_580;
      fStack_570 = local_580;
      fStack_56c = local_580;
      fStack_568 = local_580;
      fStack_564 = local_580;
      auVar30._4_4_ = fVar202 * local_580;
      auVar30._0_4_ = fVar196 * local_580;
      auVar30._8_4_ = fVar86 * local_580;
      auVar30._12_4_ = fVar87 * local_580;
      auVar30._16_4_ = fVar88 * local_580;
      auVar30._20_4_ = fVar89 * local_580;
      auVar30._24_4_ = fVar179 * local_580;
      auVar30._28_4_ = local_580;
      auVar13 = vfmadd231ps_fma(auVar30,auVar125,local_6c0);
      auVar31._4_4_ = fStack_51c * fVar202;
      auVar31._0_4_ = local_520 * fVar196;
      auVar31._8_4_ = local_520 * fVar86;
      auVar31._12_4_ = fStack_51c * fVar87;
      auVar31._16_4_ = local_520 * fVar88;
      auVar31._20_4_ = fStack_51c * fVar89;
      auVar31._24_4_ = local_520 * fVar179;
      auVar31._28_4_ = uVar194;
      auVar14 = vfmadd231ps_fma(auVar31,auVar125,local_620);
      auVar183 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x484);
      auVar156 = ZEXT3264(auVar183);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar183,local_720);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar183,local_640);
      auVar26 = *(undefined1 (*) [32])(bezier_basis1 + lVar27);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar26,local_6e0);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar26,local_3e0);
      auVar120 = ZEXT1632(auVar13);
      auVar167 = ZEXT1632(auVar11);
      auVar119 = vsubps_avx(auVar120,auVar167);
      auVar135 = ZEXT1632(auVar14);
      auVar108 = ZEXT1632(auVar12);
      auVar138 = vsubps_avx(auVar135,auVar108);
      auVar109._0_4_ = auVar12._0_4_ * auVar119._0_4_;
      auVar109._4_4_ = auVar12._4_4_ * auVar119._4_4_;
      auVar109._8_4_ = auVar12._8_4_ * auVar119._8_4_;
      auVar109._12_4_ = auVar12._12_4_ * auVar119._12_4_;
      auVar109._16_4_ = auVar119._16_4_ * 0.0;
      auVar109._20_4_ = auVar119._20_4_ * 0.0;
      auVar109._24_4_ = auVar119._24_4_ * 0.0;
      auVar109._28_4_ = 0;
      fVar185 = auVar138._0_4_;
      auVar121._0_4_ = fVar185 * auVar11._0_4_;
      fVar186 = auVar138._4_4_;
      auVar121._4_4_ = fVar186 * auVar11._4_4_;
      fVar187 = auVar138._8_4_;
      auVar121._8_4_ = fVar187 * auVar11._8_4_;
      fVar188 = auVar138._12_4_;
      auVar121._12_4_ = fVar188 * auVar11._12_4_;
      fVar189 = auVar138._16_4_;
      auVar121._16_4_ = fVar189 * 0.0;
      fVar190 = auVar138._20_4_;
      auVar121._20_4_ = fVar190 * 0.0;
      fVar210 = auVar138._24_4_;
      auVar121._24_4_ = fVar210 * 0.0;
      auVar121._28_4_ = 0;
      auVar134 = vsubps_avx(auVar109,auVar121);
      auVar11 = vpermilps_avx(*pauVar1,0xff);
      uVar118 = auVar11._0_8_;
      local_a0._8_8_ = uVar118;
      local_a0._0_8_ = uVar118;
      local_a0._16_8_ = uVar118;
      local_a0._24_8_ = uVar118;
      auVar12 = vpermilps_avx(*pauVar2,0xff);
      uVar118 = auVar12._0_8_;
      local_c0._8_8_ = uVar118;
      local_c0._0_8_ = uVar118;
      local_c0._16_8_ = uVar118;
      local_c0._24_8_ = uVar118;
      auVar12 = vpermilps_avx(*pauVar3,0xff);
      uVar118 = auVar12._0_8_;
      local_e0._8_8_ = uVar118;
      local_e0._0_8_ = uVar118;
      local_e0._16_8_ = uVar118;
      local_e0._24_8_ = uVar118;
      auVar12 = vpermilps_avx(*pauVar4,0xff);
      local_100 = auVar12._0_8_;
      fVar129 = auVar12._0_4_;
      auVar168._0_4_ = fVar117 * fVar129;
      fVar117 = auVar12._4_4_;
      auVar168._4_4_ = fVar157 * fVar117;
      auVar168._8_4_ = fVar158 * fVar129;
      auVar168._12_4_ = fVar159 * fVar117;
      auVar168._16_4_ = fVar160 * fVar129;
      auVar168._20_4_ = fVar161 * fVar117;
      auVar168._24_4_ = fVar162 * fVar129;
      auVar168._28_4_ = 0;
      auVar12 = vfmadd231ps_fma(auVar168,local_e0,auVar170);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),local_c0,auVar25);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar114,local_a0);
      uStack_f8 = local_100;
      uStack_f0 = local_100;
      uStack_e8 = local_100;
      auVar32._4_4_ = fVar202 * fVar117;
      auVar32._0_4_ = fVar196 * fVar129;
      auVar32._8_4_ = fVar86 * fVar129;
      auVar32._12_4_ = fVar87 * fVar117;
      auVar32._16_4_ = fVar88 * fVar129;
      auVar32._20_4_ = fVar89 * fVar117;
      auVar32._24_4_ = fVar179 * fVar129;
      auVar32._28_4_ = auVar114._28_4_;
      auVar13 = vfmadd231ps_fma(auVar32,auVar125,local_e0);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar183,local_c0);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar26,local_a0);
      auVar33._4_4_ = fVar186 * fVar186;
      auVar33._0_4_ = fVar185 * fVar185;
      auVar33._8_4_ = fVar187 * fVar187;
      auVar33._12_4_ = fVar188 * fVar188;
      auVar33._16_4_ = fVar189 * fVar189;
      auVar33._20_4_ = fVar190 * fVar190;
      auVar33._24_4_ = fVar210 * fVar210;
      auVar33._28_4_ = auVar11._4_4_;
      auVar11 = vfmadd231ps_fma(auVar33,auVar119,auVar119);
      auVar116 = vmaxps_avx(ZEXT1632(auVar12),ZEXT1632(auVar13));
      auVar34._4_4_ = auVar116._4_4_ * auVar116._4_4_ * auVar11._4_4_;
      auVar34._0_4_ = auVar116._0_4_ * auVar116._0_4_ * auVar11._0_4_;
      auVar34._8_4_ = auVar116._8_4_ * auVar116._8_4_ * auVar11._8_4_;
      auVar34._12_4_ = auVar116._12_4_ * auVar116._12_4_ * auVar11._12_4_;
      auVar34._16_4_ = auVar116._16_4_ * auVar116._16_4_ * 0.0;
      auVar34._20_4_ = auVar116._20_4_ * auVar116._20_4_ * 0.0;
      auVar34._24_4_ = auVar116._24_4_ * auVar116._24_4_ * 0.0;
      auVar34._28_4_ = auVar116._28_4_;
      auVar35._4_4_ = auVar134._4_4_ * auVar134._4_4_;
      auVar35._0_4_ = auVar134._0_4_ * auVar134._0_4_;
      auVar35._8_4_ = auVar134._8_4_ * auVar134._8_4_;
      auVar35._12_4_ = auVar134._12_4_ * auVar134._12_4_;
      auVar35._16_4_ = auVar134._16_4_ * auVar134._16_4_;
      auVar35._20_4_ = auVar134._20_4_ * auVar134._20_4_;
      auVar35._24_4_ = auVar134._24_4_ * auVar134._24_4_;
      auVar35._28_4_ = auVar134._28_4_;
      auVar116 = vcmpps_avx(auVar35,auVar34,2);
      fVar129 = auVar24._0_4_ * 4.7683716e-07;
      local_760._0_16_ = ZEXT416((uint)fVar129);
      auVar110._0_4_ = (float)iVar20;
      local_3c0._4_12_ = auVar17._4_12_;
      local_3c0._0_4_ = auVar110._0_4_;
      local_3c0._16_16_ = auVar148._16_16_;
      auVar110._4_4_ = auVar110._0_4_;
      auVar110._8_4_ = auVar110._0_4_;
      auVar110._12_4_ = auVar110._0_4_;
      auVar110._16_4_ = auVar110._0_4_;
      auVar110._20_4_ = auVar110._0_4_;
      auVar110._24_4_ = auVar110._0_4_;
      auVar110._28_4_ = auVar110._0_4_;
      auVar148 = vcmpps_avx(_DAT_02020f40,auVar110,1);
      auVar11 = vpermilps_avx(auVar15,0xaa);
      uVar118 = auVar11._0_8_;
      local_420._8_8_ = uVar118;
      local_420._0_8_ = uVar118;
      local_420._16_8_ = uVar118;
      local_420._24_8_ = uVar118;
      auVar24 = vpermilps_avx(auVar16,0xaa);
      uVar118 = auVar24._0_8_;
      local_600._8_8_ = uVar118;
      local_600._0_8_ = uVar118;
      local_600._16_8_ = uVar118;
      local_600._24_8_ = uVar118;
      auVar205 = ZEXT3264(local_600);
      auVar24 = vshufps_avx(auVar17,auVar17,0xaa);
      uVar118 = auVar24._0_8_;
      local_160._8_8_ = uVar118;
      local_160._0_8_ = uVar118;
      local_160._16_8_ = uVar118;
      local_160._24_8_ = uVar118;
      auVar24 = vshufps_avx(auVar18,auVar18,0xaa);
      uVar118 = auVar24._0_8_;
      register0x00001508 = uVar118;
      local_4c0 = uVar118;
      register0x00001510 = uVar118;
      register0x00001518 = uVar118;
      auVar200 = ZEXT3264(_local_4c0);
      auVar134 = auVar148 & auVar116;
      uVar97 = *(uint *)((long)&(ray->org).field_0 + 0xc);
      local_4a0._0_16_ = ZEXT416(uVar97);
      fStack_518 = local_520;
      fStack_514 = fStack_51c;
      fStack_510 = local_520;
      fStack_50c = fStack_51c;
      fStack_508 = local_520;
      fStack_504 = fStack_51c;
      if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar134 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar134 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar134 >> 0x7f,0) == '\0') &&
            (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar134 >> 0xbf,0) == '\0') &&
          (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar134[0x1f]) {
        uVar100 = 0;
        auVar174 = ZEXT3264(local_2e0);
        auVar128 = ZEXT3264(local_640);
        auVar145 = ZEXT3264(local_6c0);
        auVar178 = ZEXT3264(local_620);
        auVar184 = ZEXT3264(CONCAT428(fStack_51c,
                                      CONCAT424(local_520,
                                                CONCAT420(fStack_51c,
                                                          CONCAT416(local_520,
                                                                    CONCAT412(fStack_51c,
                                                                              CONCAT48(local_520,
                                                                                       uVar105))))))
                           );
        auVar209 = ZEXT3264(local_720);
        auVar213 = ZEXT3264(local_6e0);
      }
      else {
        _local_360 = vandps_avx(auVar116,auVar148);
        local_440._0_4_ = auVar95._0_4_;
        local_440._4_4_ = auVar95._4_4_;
        fStack_438 = auVar95._8_4_;
        fStack_434 = auVar95._12_4_;
        fStack_430 = auVar95._16_4_;
        fStack_42c = auVar95._20_4_;
        fStack_428 = auVar95._24_4_;
        fVar196 = auVar24._0_4_;
        fVar202 = auVar24._4_4_;
        auVar148._4_4_ = fVar202 * (float)local_440._4_4_;
        auVar148._0_4_ = fVar196 * (float)local_440._0_4_;
        auVar148._8_4_ = fVar196 * fStack_438;
        auVar148._12_4_ = fVar202 * fStack_434;
        auVar148._16_4_ = fVar196 * fStack_430;
        auVar148._20_4_ = fVar202 * fStack_42c;
        auVar148._24_4_ = fVar196 * fStack_428;
        auVar148._28_4_ = local_360._28_4_;
        auVar24 = vfmadd213ps_fma(auVar125,local_160,auVar148);
        auVar24 = vfmadd213ps_fma(auVar183,local_600,ZEXT1632(auVar24));
        auVar24 = vfmadd213ps_fma(auVar26,local_420,ZEXT1632(auVar24));
        _local_440 = ZEXT1632(auVar24);
        local_400._0_4_ = auVar94._0_4_;
        local_400._4_4_ = auVar94._4_4_;
        fStack_3f8 = auVar94._8_4_;
        fStack_3f4 = auVar94._12_4_;
        fStack_3f0 = auVar94._16_4_;
        fStack_3ec = auVar94._20_4_;
        fStack_3e8 = auVar94._24_4_;
        auVar36._4_4_ = fVar202 * (float)local_400._4_4_;
        auVar36._0_4_ = fVar196 * (float)local_400._0_4_;
        auVar36._8_4_ = fVar196 * fStack_3f8;
        auVar36._12_4_ = fVar202 * fStack_3f4;
        auVar36._16_4_ = fVar196 * fStack_3f0;
        auVar36._20_4_ = fVar202 * fStack_3ec;
        auVar36._24_4_ = fVar196 * fStack_3e8;
        auVar36._28_4_ = local_360._28_4_;
        auVar24 = vfmadd213ps_fma(auVar170,local_160,auVar36);
        auVar24 = vfmadd213ps_fma(auVar25,local_600,ZEXT1632(auVar24));
        auVar148 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x1210);
        auVar25 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x1694);
        auVar170 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x1b18);
        fVar117 = *(float *)(bezier_basis0 + lVar27 + 0x1f9c);
        fVar157 = *(float *)(bezier_basis0 + lVar27 + 0x1fa0);
        fVar158 = *(float *)(bezier_basis0 + lVar27 + 0x1fa4);
        fVar159 = *(float *)(bezier_basis0 + lVar27 + 0x1fa8);
        fVar160 = *(float *)(bezier_basis0 + lVar27 + 0x1fac);
        fVar161 = *(float *)(bezier_basis0 + lVar27 + 0x1fb0);
        fVar162 = *(float *)(bezier_basis0 + lVar27 + 0x1fb4);
        auVar152._0_4_ = local_580 * fVar117;
        auVar152._4_4_ = local_580 * fVar157;
        auVar152._8_4_ = local_580 * fVar158;
        auVar152._12_4_ = local_580 * fVar159;
        auVar152._16_4_ = local_580 * fVar160;
        auVar152._20_4_ = local_580 * fVar161;
        auVar152._24_4_ = local_580 * fVar162;
        auVar152._28_4_ = 0;
        auVar176._0_4_ = local_520 * fVar117;
        auVar176._4_4_ = fStack_51c * fVar157;
        auVar176._8_4_ = local_520 * fVar158;
        auVar176._12_4_ = fStack_51c * fVar159;
        auVar176._16_4_ = local_520 * fVar160;
        auVar176._20_4_ = fStack_51c * fVar161;
        auVar176._24_4_ = local_520 * fVar162;
        auVar176._28_4_ = 0;
        auVar192._0_4_ = fVar196 * fVar117;
        auVar192._4_4_ = fVar202 * fVar157;
        auVar192._8_4_ = fVar196 * fVar158;
        auVar192._12_4_ = fVar202 * fVar159;
        auVar192._16_4_ = fVar196 * fVar160;
        auVar192._20_4_ = fVar202 * fVar161;
        auVar192._24_4_ = fVar196 * fVar162;
        auVar192._28_4_ = 0;
        auVar14 = vfmadd231ps_fma(auVar152,auVar170,local_6c0);
        auVar15 = vfmadd231ps_fma(auVar176,auVar170,local_620);
        auVar16 = vfmadd231ps_fma(auVar192,local_160,auVar170);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar25,local_720);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar25,local_640);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar25,local_600);
        _local_400 = auVar138;
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar148,local_6e0);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar148,local_3e0);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),local_420,auVar148);
        fVar117 = *(float *)(bezier_basis1 + lVar27 + 0x1f9c);
        fVar157 = *(float *)(bezier_basis1 + lVar27 + 0x1fa0);
        fVar158 = *(float *)(bezier_basis1 + lVar27 + 0x1fa4);
        fVar159 = *(float *)(bezier_basis1 + lVar27 + 0x1fa8);
        fVar160 = *(float *)(bezier_basis1 + lVar27 + 0x1fac);
        fVar161 = *(float *)(bezier_basis1 + lVar27 + 0x1fb0);
        fVar162 = *(float *)(bezier_basis1 + lVar27 + 0x1fb4);
        auVar37._4_4_ = local_580 * fVar157;
        auVar37._0_4_ = local_580 * fVar117;
        auVar37._8_4_ = local_580 * fVar158;
        auVar37._12_4_ = local_580 * fVar159;
        auVar37._16_4_ = local_580 * fVar160;
        auVar37._20_4_ = local_580 * fVar161;
        auVar37._24_4_ = local_580 * fVar162;
        auVar37._28_4_ = auVar148._28_4_;
        auVar38._4_4_ = fStack_51c * fVar157;
        auVar38._0_4_ = local_520 * fVar117;
        auVar38._8_4_ = local_520 * fVar158;
        auVar38._12_4_ = fStack_51c * fVar159;
        auVar38._16_4_ = local_520 * fVar160;
        auVar38._20_4_ = fStack_51c * fVar161;
        auVar38._24_4_ = local_520 * fVar162;
        auVar38._28_4_ = fVar202;
        auVar39._4_4_ = fVar202 * fVar157;
        auVar39._0_4_ = fVar196 * fVar117;
        auVar39._8_4_ = fVar196 * fVar158;
        auVar39._12_4_ = fVar202 * fVar159;
        auVar39._16_4_ = fVar196 * fVar160;
        auVar39._20_4_ = fVar202 * fVar161;
        auVar39._24_4_ = fVar196 * fVar162;
        auVar39._28_4_ = auVar11._4_4_;
        auVar148 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x1b18);
        auVar11 = vfmadd231ps_fma(auVar37,auVar148,local_6c0);
        auVar17 = vfmadd231ps_fma(auVar38,auVar148,local_620);
        auVar18 = vfmadd231ps_fma(auVar39,auVar148,local_160);
        auVar148 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x1694);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar148,local_720);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar148,local_640);
        auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),local_600,auVar148);
        auVar148 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x1210);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar148,local_6e0);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar148,local_3e0);
        auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),local_420,auVar148);
        auVar148 = vandps_avx(local_1a0,ZEXT1632(auVar14));
        auVar25 = vandps_avx(ZEXT1632(auVar15),local_1a0);
        auVar25 = vmaxps_avx(auVar148,auVar25);
        auVar148 = vandps_avx(ZEXT1632(auVar16),local_1a0);
        auVar148 = vmaxps_avx(auVar25,auVar148);
        auVar122._4_4_ = fVar129;
        auVar122._0_4_ = fVar129;
        auVar122._8_4_ = fVar129;
        auVar122._12_4_ = fVar129;
        auVar122._16_4_ = fVar129;
        auVar122._20_4_ = fVar129;
        auVar122._24_4_ = fVar129;
        auVar122._28_4_ = fVar129;
        auVar148 = vcmpps_avx(auVar148,auVar122,1);
        auVar170 = vblendvps_avx(ZEXT1632(auVar14),auVar119,auVar148);
        auVar125 = vblendvps_avx(ZEXT1632(auVar15),auVar138,auVar148);
        auVar148 = vandps_avx(ZEXT1632(auVar11),local_1a0);
        auVar25 = vandps_avx(ZEXT1632(auVar17),local_1a0);
        auVar25 = vmaxps_avx(auVar148,auVar25);
        auVar148 = vandps_avx(ZEXT1632(auVar18),local_1a0);
        auVar148 = vmaxps_avx(auVar25,auVar148);
        auVar25 = vcmpps_avx(auVar148,auVar122,1);
        auVar148 = vblendvps_avx(ZEXT1632(auVar11),auVar119,auVar25);
        auVar25 = vblendvps_avx(ZEXT1632(auVar17),auVar138,auVar25);
        auVar24 = vfmadd213ps_fma(auVar114,local_420,ZEXT1632(auVar24));
        auVar11 = vfmadd213ps_fma(auVar170,auVar170,ZEXT832(0) << 0x20);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar125,auVar125);
        auVar114 = vrsqrtps_avx(ZEXT1632(auVar11));
        fVar117 = auVar114._0_4_;
        fVar157 = auVar114._4_4_;
        fVar158 = auVar114._8_4_;
        fVar159 = auVar114._12_4_;
        fVar160 = auVar114._16_4_;
        fVar161 = auVar114._20_4_;
        fVar162 = auVar114._24_4_;
        auVar40._4_4_ = fVar157 * fVar157 * fVar157 * auVar11._4_4_ * -0.5;
        auVar40._0_4_ = fVar117 * fVar117 * fVar117 * auVar11._0_4_ * -0.5;
        auVar40._8_4_ = fVar158 * fVar158 * fVar158 * auVar11._8_4_ * -0.5;
        auVar40._12_4_ = fVar159 * fVar159 * fVar159 * auVar11._12_4_ * -0.5;
        auVar40._16_4_ = fVar160 * fVar160 * fVar160 * -0.0;
        auVar40._20_4_ = fVar161 * fVar161 * fVar161 * -0.0;
        auVar40._24_4_ = fVar162 * fVar162 * fVar162 * -0.0;
        auVar40._28_4_ = 0;
        auVar207._8_4_ = 0x3fc00000;
        auVar207._0_8_ = 0x3fc000003fc00000;
        auVar207._12_4_ = 0x3fc00000;
        auVar207._16_4_ = 0x3fc00000;
        auVar207._20_4_ = 0x3fc00000;
        auVar207._24_4_ = 0x3fc00000;
        auVar207._28_4_ = 0x3fc00000;
        auVar11 = vfmadd231ps_fma(auVar40,auVar207,auVar114);
        fVar117 = auVar11._0_4_;
        fVar157 = auVar11._4_4_;
        auVar41._4_4_ = auVar125._4_4_ * fVar157;
        auVar41._0_4_ = auVar125._0_4_ * fVar117;
        fVar158 = auVar11._8_4_;
        auVar41._8_4_ = auVar125._8_4_ * fVar158;
        fVar159 = auVar11._12_4_;
        auVar41._12_4_ = auVar125._12_4_ * fVar159;
        auVar41._16_4_ = auVar125._16_4_ * 0.0;
        auVar41._20_4_ = auVar125._20_4_ * 0.0;
        auVar41._24_4_ = auVar125._24_4_ * 0.0;
        auVar41._28_4_ = auVar114._28_4_;
        auVar42._4_4_ = -auVar170._4_4_ * fVar157;
        auVar42._0_4_ = -auVar170._0_4_ * fVar117;
        auVar42._8_4_ = -auVar170._8_4_ * fVar158;
        auVar42._12_4_ = -auVar170._12_4_ * fVar159;
        auVar42._16_4_ = -auVar170._16_4_ * 0.0;
        auVar42._20_4_ = -auVar170._20_4_ * 0.0;
        auVar42._24_4_ = -auVar170._24_4_ * 0.0;
        auVar42._28_4_ = auVar170._28_4_ ^ 0x80000000;
        auVar11 = vfmadd213ps_fma(auVar148,auVar148,ZEXT832(0) << 0x20);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar25,auVar25);
        auVar170 = vrsqrtps_avx(ZEXT1632(auVar11));
        auVar114 = ZEXT1632(CONCAT412(fVar159 * 0.0,
                                      CONCAT48(fVar158 * 0.0,CONCAT44(fVar157 * 0.0,fVar117 * 0.0)))
                           );
        fVar117 = auVar170._0_4_;
        fVar157 = auVar170._4_4_;
        fVar158 = auVar170._8_4_;
        fVar159 = auVar170._12_4_;
        fVar160 = auVar170._16_4_;
        fVar161 = auVar170._20_4_;
        fVar162 = auVar170._24_4_;
        auVar43._4_4_ = fVar157 * fVar157 * auVar11._4_4_ * -0.5 * fVar157;
        auVar43._0_4_ = fVar117 * fVar117 * auVar11._0_4_ * -0.5 * fVar117;
        auVar43._8_4_ = fVar158 * fVar158 * auVar11._8_4_ * -0.5 * fVar158;
        auVar43._12_4_ = fVar159 * fVar159 * auVar11._12_4_ * -0.5 * fVar159;
        auVar43._16_4_ = fVar160 * fVar160 * fVar160 * -0.0;
        auVar43._20_4_ = fVar161 * fVar161 * fVar161 * -0.0;
        auVar43._24_4_ = fVar162 * fVar162 * fVar162 * -0.0;
        auVar43._28_4_ = 0xbf000000;
        auVar11 = vfmadd231ps_fma(auVar43,auVar207,auVar170);
        fVar117 = auVar11._0_4_;
        fVar157 = auVar11._4_4_;
        auVar44._4_4_ = fVar157 * auVar25._4_4_;
        auVar44._0_4_ = fVar117 * auVar25._0_4_;
        fVar158 = auVar11._8_4_;
        auVar44._8_4_ = fVar158 * auVar25._8_4_;
        fVar159 = auVar11._12_4_;
        auVar44._12_4_ = fVar159 * auVar25._12_4_;
        auVar44._16_4_ = auVar25._16_4_ * 0.0;
        auVar44._20_4_ = auVar25._20_4_ * 0.0;
        auVar44._24_4_ = auVar25._24_4_ * 0.0;
        auVar44._28_4_ = 0;
        auVar45._4_4_ = fVar157 * -auVar148._4_4_;
        auVar45._0_4_ = fVar117 * -auVar148._0_4_;
        auVar45._8_4_ = fVar158 * -auVar148._8_4_;
        auVar45._12_4_ = fVar159 * -auVar148._12_4_;
        auVar45._16_4_ = -auVar148._16_4_ * 0.0;
        auVar45._20_4_ = -auVar148._20_4_ * 0.0;
        auVar45._24_4_ = -auVar148._24_4_ * 0.0;
        auVar45._28_4_ = 0;
        auVar46._28_4_ = auVar170._28_4_;
        auVar46._0_28_ =
             ZEXT1628(CONCAT412(fVar159 * 0.0,
                                CONCAT48(fVar158 * 0.0,CONCAT44(fVar157 * 0.0,fVar117 * 0.0))));
        auVar11 = vfmadd213ps_fma(auVar41,ZEXT1632(auVar12),auVar167);
        auVar148 = ZEXT1632(auVar12);
        auVar14 = vfmadd213ps_fma(auVar42,auVar148,auVar108);
        auVar15 = vfmadd213ps_fma(auVar114,auVar148,ZEXT1632(auVar24));
        auVar106 = vfnmadd213ps_fma(auVar41,auVar148,auVar167);
        auVar16 = vfmadd213ps_fma(auVar44,ZEXT1632(auVar13),auVar120);
        auVar163 = vfnmadd213ps_fma(auVar42,auVar148,auVar108);
        auVar148 = ZEXT1632(auVar13);
        auVar17 = vfmadd213ps_fma(auVar45,auVar148,auVar135);
        local_780 = ZEXT1632(auVar12);
        auVar164 = vfnmadd231ps_fma(ZEXT1632(auVar24),local_780,auVar114);
        auVar12 = vfmadd213ps_fma(auVar46,auVar148,_local_440);
        auVar29 = vfnmadd213ps_fma(auVar44,auVar148,auVar120);
        auVar146 = vfnmadd213ps_fma(auVar45,auVar148,auVar135);
        auVar165 = vfnmadd231ps_fma(_local_440,ZEXT1632(auVar13),auVar46);
        auVar148 = vsubps_avx(ZEXT1632(auVar17),ZEXT1632(auVar163));
        auVar25 = vsubps_avx(ZEXT1632(auVar12),ZEXT1632(auVar164));
        auVar136._0_4_ = auVar164._0_4_ * auVar148._0_4_;
        auVar136._4_4_ = auVar164._4_4_ * auVar148._4_4_;
        auVar136._8_4_ = auVar164._8_4_ * auVar148._8_4_;
        auVar136._12_4_ = auVar164._12_4_ * auVar148._12_4_;
        auVar136._16_4_ = auVar148._16_4_ * 0.0;
        auVar136._20_4_ = auVar148._20_4_ * 0.0;
        auVar136._24_4_ = auVar148._24_4_ * 0.0;
        auVar136._28_4_ = 0;
        auVar18 = vfmsub231ps_fma(auVar136,ZEXT1632(auVar163),auVar25);
        auVar47._4_4_ = auVar25._4_4_ * auVar106._4_4_;
        auVar47._0_4_ = auVar25._0_4_ * auVar106._0_4_;
        auVar47._8_4_ = auVar25._8_4_ * auVar106._8_4_;
        auVar47._12_4_ = auVar25._12_4_ * auVar106._12_4_;
        auVar47._16_4_ = auVar25._16_4_ * 0.0;
        auVar47._20_4_ = auVar25._20_4_ * 0.0;
        auVar47._24_4_ = auVar25._24_4_ * 0.0;
        auVar47._28_4_ = auVar25._28_4_;
        auVar25 = vsubps_avx(ZEXT1632(auVar16),ZEXT1632(auVar106));
        auVar24 = vfmsub231ps_fma(auVar47,ZEXT1632(auVar164),auVar25);
        auVar48._4_4_ = auVar163._4_4_ * auVar25._4_4_;
        auVar48._0_4_ = auVar163._0_4_ * auVar25._0_4_;
        auVar48._8_4_ = auVar163._8_4_ * auVar25._8_4_;
        auVar48._12_4_ = auVar163._12_4_ * auVar25._12_4_;
        auVar48._16_4_ = auVar25._16_4_ * 0.0;
        auVar48._20_4_ = auVar25._20_4_ * 0.0;
        auVar48._24_4_ = auVar25._24_4_ * 0.0;
        auVar48._28_4_ = auVar25._28_4_;
        auVar125 = ZEXT1632(auVar106);
        auVar106 = vfmsub231ps_fma(auVar48,auVar125,auVar148);
        auVar24 = vfmadd231ps_fma(ZEXT1632(auVar106),ZEXT832(0) << 0x20,ZEXT1632(auVar24));
        auVar24 = vfmadd231ps_fma(ZEXT1632(auVar24),ZEXT832(0) << 0x20,ZEXT1632(auVar18));
        auVar116 = vcmpps_avx(ZEXT1632(auVar24),ZEXT832(0) << 0x20,2);
        local_660 = vblendvps_avx(ZEXT1632(auVar29),ZEXT1632(auVar11),auVar116);
        auVar148 = vblendvps_avx(ZEXT1632(auVar146),ZEXT1632(auVar14),auVar116);
        local_5a0 = vblendvps_avx(ZEXT1632(auVar165),ZEXT1632(auVar15),auVar116);
        auVar25 = vblendvps_avx(auVar125,ZEXT1632(auVar16),auVar116);
        auVar170 = vblendvps_avx(ZEXT1632(auVar163),ZEXT1632(auVar17),auVar116);
        auVar114 = vblendvps_avx(ZEXT1632(auVar164),ZEXT1632(auVar12),auVar116);
        auVar125 = vblendvps_avx(ZEXT1632(auVar16),auVar125,auVar116);
        auVar183 = vblendvps_avx(ZEXT1632(auVar17),ZEXT1632(auVar163),auVar116);
        auVar24 = vpackssdw_avx(local_360._0_16_,local_360._16_16_);
        _local_7a0 = ZEXT1632(auVar24);
        auVar26 = vblendvps_avx(ZEXT1632(auVar12),ZEXT1632(auVar164),auVar116);
        auVar119 = vsubps_avx(auVar125,local_660);
        auVar138 = vsubps_avx(auVar183,auVar148);
        auVar134 = vsubps_avx(auVar26,local_5a0);
        auVar108 = vsubps_avx(local_660,auVar25);
        auVar120 = vsubps_avx(auVar148,auVar170);
        auVar135 = vsubps_avx(local_5a0,auVar114);
        auVar49._4_4_ = auVar134._4_4_ * local_660._4_4_;
        auVar49._0_4_ = auVar134._0_4_ * local_660._0_4_;
        auVar49._8_4_ = auVar134._8_4_ * local_660._8_4_;
        auVar49._12_4_ = auVar134._12_4_ * local_660._12_4_;
        auVar49._16_4_ = auVar134._16_4_ * local_660._16_4_;
        auVar49._20_4_ = auVar134._20_4_ * local_660._20_4_;
        auVar49._24_4_ = auVar134._24_4_ * local_660._24_4_;
        auVar49._28_4_ = auVar26._28_4_;
        auVar11 = vfmsub231ps_fma(auVar49,local_5a0,auVar119);
        auVar50._4_4_ = auVar148._4_4_ * auVar119._4_4_;
        auVar50._0_4_ = auVar148._0_4_ * auVar119._0_4_;
        auVar50._8_4_ = auVar148._8_4_ * auVar119._8_4_;
        auVar50._12_4_ = auVar148._12_4_ * auVar119._12_4_;
        auVar50._16_4_ = auVar148._16_4_ * auVar119._16_4_;
        auVar50._20_4_ = auVar148._20_4_ * auVar119._20_4_;
        auVar50._24_4_ = auVar148._24_4_ * auVar119._24_4_;
        auVar50._28_4_ = auVar125._28_4_;
        auVar12 = vfmsub231ps_fma(auVar50,local_660,auVar138);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT832(0) << 0x20,ZEXT1632(auVar11));
        auVar111._0_4_ = auVar138._0_4_ * local_5a0._0_4_;
        auVar111._4_4_ = auVar138._4_4_ * local_5a0._4_4_;
        auVar111._8_4_ = auVar138._8_4_ * local_5a0._8_4_;
        auVar111._12_4_ = auVar138._12_4_ * local_5a0._12_4_;
        auVar111._16_4_ = auVar138._16_4_ * local_5a0._16_4_;
        auVar111._20_4_ = auVar138._20_4_ * local_5a0._20_4_;
        auVar111._24_4_ = auVar138._24_4_ * local_5a0._24_4_;
        auVar111._28_4_ = 0;
        auVar12 = vfmsub231ps_fma(auVar111,auVar148,auVar134);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar11),ZEXT832(0) << 0x20,ZEXT1632(auVar12));
        auVar112._0_4_ = auVar135._0_4_ * auVar25._0_4_;
        auVar112._4_4_ = auVar135._4_4_ * auVar25._4_4_;
        auVar112._8_4_ = auVar135._8_4_ * auVar25._8_4_;
        auVar112._12_4_ = auVar135._12_4_ * auVar25._12_4_;
        auVar112._16_4_ = auVar135._16_4_ * auVar25._16_4_;
        auVar112._20_4_ = auVar135._20_4_ * auVar25._20_4_;
        auVar112._24_4_ = auVar135._24_4_ * auVar25._24_4_;
        auVar112._28_4_ = 0;
        auVar11 = vfmsub231ps_fma(auVar112,auVar108,auVar114);
        auVar51._4_4_ = auVar120._4_4_ * auVar114._4_4_;
        auVar51._0_4_ = auVar120._0_4_ * auVar114._0_4_;
        auVar51._8_4_ = auVar120._8_4_ * auVar114._8_4_;
        auVar51._12_4_ = auVar120._12_4_ * auVar114._12_4_;
        auVar51._16_4_ = auVar120._16_4_ * auVar114._16_4_;
        auVar51._20_4_ = auVar120._20_4_ * auVar114._20_4_;
        auVar51._24_4_ = auVar120._24_4_ * auVar114._24_4_;
        auVar51._28_4_ = auVar114._28_4_;
        auVar14 = vfmsub231ps_fma(auVar51,auVar170,auVar135);
        auVar52._4_4_ = auVar108._4_4_ * auVar170._4_4_;
        auVar52._0_4_ = auVar108._0_4_ * auVar170._0_4_;
        auVar52._8_4_ = auVar108._8_4_ * auVar170._8_4_;
        auVar52._12_4_ = auVar108._12_4_ * auVar170._12_4_;
        auVar52._16_4_ = auVar108._16_4_ * auVar170._16_4_;
        auVar52._20_4_ = auVar108._20_4_ * auVar170._20_4_;
        auVar52._24_4_ = auVar108._24_4_ * auVar170._24_4_;
        auVar52._28_4_ = auVar183._28_4_;
        auVar15 = vfmsub231ps_fma(auVar52,auVar120,auVar25);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT832(0) << 0x20,ZEXT1632(auVar11));
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar11),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
        auVar156 = ZEXT1664(auVar14);
        auVar25 = vmaxps_avx(ZEXT1632(auVar12),ZEXT1632(auVar14));
        auVar25 = vcmpps_avx(auVar25,ZEXT832(0) << 0x20,2);
        auVar11 = vpackssdw_avx(auVar25._0_16_,auVar25._16_16_);
        auVar24 = vpand_avx(auVar11,auVar24);
        auVar25 = vpmovsxwd_avx2(auVar24);
        if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar25 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar25 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar25 >> 0x7f,0) == '\0') &&
              (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar25 >> 0xbf,0) == '\0') &&
            (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar25[0x1f]) {
LAB_018d0dfa:
          auVar174 = ZEXT3264(CONCAT824(uStack_448,
                                        CONCAT816(uStack_450,CONCAT88(uStack_458,local_460))));
          auVar208._8_4_ = local_520;
          auVar208._0_8_ = uVar105;
          auVar208._12_4_ = fStack_51c;
          auVar208._16_4_ = local_520;
          auVar208._20_4_ = fStack_51c;
          auVar208._24_4_ = local_520;
          auVar208._28_4_ = fStack_51c;
        }
        else {
          auVar53._4_4_ = auVar138._4_4_ * auVar135._4_4_;
          auVar53._0_4_ = auVar138._0_4_ * auVar135._0_4_;
          auVar53._8_4_ = auVar138._8_4_ * auVar135._8_4_;
          auVar53._12_4_ = auVar138._12_4_ * auVar135._12_4_;
          auVar53._16_4_ = auVar138._16_4_ * auVar135._16_4_;
          auVar53._20_4_ = auVar138._20_4_ * auVar135._20_4_;
          auVar53._24_4_ = auVar138._24_4_ * auVar135._24_4_;
          auVar53._28_4_ = auVar25._28_4_;
          auVar17 = vfmsub231ps_fma(auVar53,auVar120,auVar134);
          auVar123._0_4_ = auVar134._0_4_ * auVar108._0_4_;
          auVar123._4_4_ = auVar134._4_4_ * auVar108._4_4_;
          auVar123._8_4_ = auVar134._8_4_ * auVar108._8_4_;
          auVar123._12_4_ = auVar134._12_4_ * auVar108._12_4_;
          auVar123._16_4_ = auVar134._16_4_ * auVar108._16_4_;
          auVar123._20_4_ = auVar134._20_4_ * auVar108._20_4_;
          auVar123._24_4_ = auVar134._24_4_ * auVar108._24_4_;
          auVar123._28_4_ = 0;
          auVar16 = vfmsub231ps_fma(auVar123,auVar119,auVar135);
          auVar54._4_4_ = auVar120._4_4_ * auVar119._4_4_;
          auVar54._0_4_ = auVar120._0_4_ * auVar119._0_4_;
          auVar54._8_4_ = auVar120._8_4_ * auVar119._8_4_;
          auVar54._12_4_ = auVar120._12_4_ * auVar119._12_4_;
          auVar54._16_4_ = auVar120._16_4_ * auVar119._16_4_;
          auVar54._20_4_ = auVar120._20_4_ * auVar119._20_4_;
          auVar54._24_4_ = auVar120._24_4_ * auVar119._24_4_;
          auVar54._28_4_ = auVar170._28_4_;
          auVar18 = vfmsub231ps_fma(auVar54,auVar108,auVar138);
          auVar11 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar16),ZEXT1632(auVar18));
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar11),ZEXT1632(auVar17),_DAT_02020f00);
          auVar25 = vrcpps_avx(ZEXT1632(auVar15));
          auVar193._8_4_ = 0x3f800000;
          auVar193._0_8_ = &DAT_3f8000003f800000;
          auVar193._12_4_ = 0x3f800000;
          auVar193._16_4_ = 0x3f800000;
          auVar193._20_4_ = 0x3f800000;
          auVar193._24_4_ = 0x3f800000;
          auVar193._28_4_ = 0x3f800000;
          auVar11 = vfnmadd213ps_fma(auVar25,ZEXT1632(auVar15),auVar193);
          auVar11 = vfmadd132ps_fma(ZEXT1632(auVar11),auVar25,auVar25);
          auVar169._0_4_ = auVar18._0_4_ * local_5a0._0_4_;
          auVar169._4_4_ = auVar18._4_4_ * local_5a0._4_4_;
          auVar169._8_4_ = auVar18._8_4_ * local_5a0._8_4_;
          auVar169._12_4_ = auVar18._12_4_ * local_5a0._12_4_;
          auVar169._16_4_ = local_5a0._16_4_ * 0.0;
          auVar169._20_4_ = local_5a0._20_4_ * 0.0;
          auVar169._24_4_ = local_5a0._24_4_ * 0.0;
          auVar169._28_4_ = 0;
          auVar16 = vfmadd231ps_fma(auVar169,auVar148,ZEXT1632(auVar16));
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT1632(auVar17),local_660);
          fVar157 = auVar11._0_4_;
          fVar158 = auVar11._4_4_;
          fVar159 = auVar11._8_4_;
          fVar160 = auVar11._12_4_;
          auVar170 = ZEXT1632(CONCAT412(fVar160 * auVar16._12_4_,
                                        CONCAT48(fVar159 * auVar16._8_4_,
                                                 CONCAT44(fVar158 * auVar16._4_4_,
                                                          fVar157 * auVar16._0_4_))));
          auVar113._4_4_ = uVar97;
          auVar113._0_4_ = uVar97;
          auVar113._8_4_ = uVar97;
          auVar113._12_4_ = uVar97;
          auVar113._16_4_ = uVar97;
          auVar113._20_4_ = uVar97;
          auVar113._24_4_ = uVar97;
          auVar113._28_4_ = uVar97;
          fVar117 = ray->tfar;
          auVar124._4_4_ = fVar117;
          auVar124._0_4_ = fVar117;
          auVar124._8_4_ = fVar117;
          auVar124._12_4_ = fVar117;
          auVar124._16_4_ = fVar117;
          auVar124._20_4_ = fVar117;
          auVar124._24_4_ = fVar117;
          auVar124._28_4_ = fVar117;
          auVar148 = vcmpps_avx(auVar113,auVar170,2);
          auVar25 = vcmpps_avx(auVar170,auVar124,2);
          auVar148 = vandps_avx(auVar25,auVar148);
          auVar11 = vpackssdw_avx(auVar148._0_16_,auVar148._16_16_);
          auVar24 = vpand_avx(auVar24,auVar11);
          auVar148 = vpmovsxwd_avx2(auVar24);
          if ((((((((auVar148 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar148 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar148 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar148 >> 0x7f,0) == '\0') &&
                (auVar148 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar148 >> 0xbf,0) == '\0') &&
              (auVar148 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar148[0x1f]) goto LAB_018d0dfa;
          auVar148 = vcmpps_avx(ZEXT1632(auVar15),ZEXT832(0) << 0x20,4);
          auVar11 = vpackssdw_avx(auVar148._0_16_,auVar148._16_16_);
          auVar24 = vpand_avx(auVar24,auVar11);
          auVar148 = vpmovsxwd_avx2(auVar24);
          auVar174 = ZEXT3264(CONCAT824(uStack_448,
                                        CONCAT816(uStack_450,CONCAT88(uStack_458,local_460))));
          auVar208._8_4_ = local_520;
          auVar208._0_8_ = uVar105;
          auVar208._12_4_ = fStack_51c;
          auVar208._16_4_ = local_520;
          auVar208._20_4_ = fStack_51c;
          auVar208._24_4_ = local_520;
          auVar208._28_4_ = fStack_51c;
          if ((((((((auVar148 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar148 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar148 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar148 >> 0x7f,0) != '\0') ||
                (auVar148 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar148 >> 0xbf,0) != '\0') ||
              (auVar148 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar148[0x1f] < '\0') {
            auVar114 = ZEXT1632(CONCAT412(fVar160 * auVar12._12_4_,
                                          CONCAT48(fVar159 * auVar12._8_4_,
                                                   CONCAT44(fVar158 * auVar12._4_4_,
                                                            fVar157 * auVar12._0_4_))));
            auVar125 = ZEXT1632(CONCAT412(fVar160 * auVar14._12_4_,
                                          CONCAT48(fVar159 * auVar14._8_4_,
                                                   CONCAT44(fVar158 * auVar14._4_4_,
                                                            fVar157 * auVar14._0_4_))));
            auVar147._8_4_ = 0x3f800000;
            auVar147._0_8_ = &DAT_3f8000003f800000;
            auVar147._12_4_ = 0x3f800000;
            auVar147._16_4_ = 0x3f800000;
            auVar147._20_4_ = 0x3f800000;
            auVar147._24_4_ = 0x3f800000;
            auVar147._28_4_ = 0x3f800000;
            auVar25 = vsubps_avx(auVar147,auVar114);
            _local_180 = vblendvps_avx(auVar25,auVar114,auVar116);
            auVar25 = vsubps_avx(auVar147,auVar125);
            local_380 = vblendvps_avx(auVar25,auVar125,auVar116);
            auVar174 = ZEXT3264(auVar148);
            local_2e0 = auVar170;
          }
        }
        auVar213 = ZEXT3264(local_6e0);
        auVar148 = auVar174._0_32_;
        if ((((((((auVar148 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar148 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar148 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar148 >> 0x7f,0) != '\0') ||
              (auVar174 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
             SUB321(auVar148 >> 0xbf,0) != '\0') ||
            (auVar174 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
            auVar174[0x1f] < '\0') {
          auVar25 = vsubps_avx(ZEXT1632(auVar13),local_780);
          auVar24 = vfmadd213ps_fma(auVar25,_local_180,local_780);
          fVar117 = pre->depth_scale;
          auVar55._4_4_ = (auVar24._4_4_ + auVar24._4_4_) * fVar117;
          auVar55._0_4_ = (auVar24._0_4_ + auVar24._0_4_) * fVar117;
          auVar55._8_4_ = (auVar24._8_4_ + auVar24._8_4_) * fVar117;
          auVar55._12_4_ = (auVar24._12_4_ + auVar24._12_4_) * fVar117;
          auVar55._16_4_ = fVar117 * 0.0;
          auVar55._20_4_ = fVar117 * 0.0;
          auVar55._24_4_ = fVar117 * 0.0;
          auVar55._28_4_ = 0;
          auVar174 = ZEXT3264(local_2e0);
          auVar25 = vcmpps_avx(local_2e0,auVar55,6);
          auVar170 = auVar148 & auVar25;
          auVar205 = ZEXT3264(local_600);
          auVar178 = ZEXT3264(local_620);
          if ((((((((auVar170 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar170 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar170 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar170 >> 0x7f,0) != '\0') ||
                (auVar170 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar170 >> 0xbf,0) != '\0') ||
              (auVar170 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar170[0x1f] < '\0') {
            local_260 = vandps_avx(auVar25,auVar148);
            auVar126._8_4_ = 0xbf800000;
            auVar126._0_8_ = 0xbf800000bf800000;
            auVar126._12_4_ = 0xbf800000;
            auVar126._16_4_ = 0xbf800000;
            auVar126._20_4_ = 0xbf800000;
            auVar126._24_4_ = 0xbf800000;
            auVar126._28_4_ = 0xbf800000;
            auVar137._8_4_ = 0x40000000;
            auVar137._0_8_ = 0x4000000040000000;
            auVar137._12_4_ = 0x40000000;
            auVar137._16_4_ = 0x40000000;
            auVar137._20_4_ = 0x40000000;
            auVar137._24_4_ = 0x40000000;
            auVar137._28_4_ = 0x40000000;
            auVar24 = vfmadd213ps_fma(local_380,auVar137,auVar126);
            local_320 = _local_180;
            local_300 = ZEXT1632(auVar24);
            local_2c0 = 0;
            local_2bc = iVar20;
            local_2b0 = *(undefined8 *)*pauVar1;
            uStack_2a8 = *(undefined8 *)(*pauVar1 + 8);
            local_2a0 = *(undefined8 *)*pauVar2;
            uStack_298 = *(undefined8 *)(*pauVar2 + 8);
            local_290 = *(undefined8 *)*pauVar3;
            uStack_288 = *(undefined8 *)(*pauVar3 + 8);
            local_280 = *(undefined8 *)*pauVar4;
            uStack_278 = *(undefined8 *)(*pauVar4 + 8);
            auVar200 = ZEXT3264(_local_4c0);
            local_380 = ZEXT1632(auVar24);
            auVar148 = local_380;
            if ((pGVar21->mask & ray->mask) == 0) {
              uVar100 = 0;
              auVar145 = ZEXT3264(local_6c0);
              auVar184 = ZEXT3264(auVar208);
              auVar209 = ZEXT3264(local_720);
            }
            else {
              auVar145 = ZEXT3264(local_6c0);
              auVar184 = ZEXT3264(auVar208);
              auVar209 = ZEXT3264(local_720);
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (uVar100 = CONCAT71((int7)(uVar100 >> 8),1),
                 pGVar21->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                fVar129 = 1.0 / auVar110._0_4_;
                local_240[0] = fVar129 * ((float)local_180._0_4_ + 0.0);
                local_240[1] = fVar129 * ((float)local_180._4_4_ + 1.0);
                local_240[2] = fVar129 * (fStack_178 + 2.0);
                local_240[3] = fVar129 * (fStack_174 + 3.0);
                fStack_230 = fVar129 * (fStack_170 + 4.0);
                fStack_22c = fVar129 * (fStack_16c + 5.0);
                fStack_228 = fVar129 * (fStack_168 + 6.0);
                fStack_224 = fStack_164 + 7.0;
                local_380._0_8_ = auVar24._0_8_;
                local_380._8_8_ = auVar24._8_8_;
                local_220 = local_380._0_8_;
                uStack_218 = local_380._8_8_;
                uStack_210 = 0;
                uStack_208 = 0;
                local_200 = local_2e0;
                uVar97 = vmovmskps_avx(local_260);
                uVar100 = CONCAT71((int7)(uVar100 >> 8),uVar97 != 0);
                local_380 = auVar148;
                if (uVar97 != 0) {
                  lVar103 = 0;
                  auVar101 = (undefined1  [8])(ulong)(uVar97 & 0xff);
                  for (uVar98 = (ulong)auVar101; (uVar98 & 1) == 0;
                      uVar98 = uVar98 >> 1 | 0x8000000000000000) {
                    lVar103 = lVar103 + 1;
                  }
                  local_540 = ZEXT1632(*pauVar2);
                  local_480 = ZEXT1632(*pauVar3);
                  _local_560 = ZEXT1632(*pauVar4);
                  local_700 = local_2e0;
                  local_7b0 = context;
                  local_7a8 = ray;
                  local_730 = pre;
                  do {
                    local_5d4 = local_240[lVar103];
                    local_5d0 = *(undefined4 *)((long)&local_220 + lVar103 * 4);
                    local_5a0._0_4_ = ray->tfar;
                    local_660._0_8_ = lVar103;
                    ray->tfar = *(float *)(local_200 + lVar103 * 4);
                    local_690.context = context->user;
                    fVar117 = 1.0 - local_5d4;
                    fVar129 = fVar117 * fVar117 * -3.0;
                    auVar24 = vfmadd231ss_fma(ZEXT416((uint)(fVar117 * fVar117)),
                                              ZEXT416((uint)(local_5d4 * fVar117)),
                                              ZEXT416(0xc0000000));
                    auVar11 = vfmsub132ss_fma(ZEXT416((uint)(local_5d4 * fVar117)),
                                              ZEXT416((uint)(local_5d4 * local_5d4)),
                                              ZEXT416(0x40000000));
                    fVar117 = auVar24._0_4_ * 3.0;
                    fVar157 = auVar11._0_4_ * 3.0;
                    fVar158 = local_5d4 * local_5d4 * 3.0;
                    auVar150._0_4_ = fVar158 * (float)local_560._0_4_;
                    auVar150._4_4_ = fVar158 * (float)local_560._4_4_;
                    auVar150._8_4_ = fVar158 * (float)uStack_558;
                    auVar150._12_4_ = fVar158 * uStack_558._4_4_;
                    auVar156 = ZEXT1664(auVar150);
                    auVar130._4_4_ = fVar157;
                    auVar130._0_4_ = fVar157;
                    auVar130._8_4_ = fVar157;
                    auVar130._12_4_ = fVar157;
                    auVar24 = vfmadd132ps_fma(auVar130,auVar150,local_480._0_16_);
                    auVar140._4_4_ = fVar117;
                    auVar140._0_4_ = fVar117;
                    auVar140._8_4_ = fVar117;
                    auVar140._12_4_ = fVar117;
                    auVar24 = vfmadd132ps_fma(auVar140,auVar24,local_540._0_16_);
                    auVar131._4_4_ = fVar129;
                    auVar131._0_4_ = fVar129;
                    auVar131._8_4_ = fVar129;
                    auVar131._12_4_ = fVar129;
                    auVar90._8_8_ = uStack_698;
                    auVar90._0_8_ = local_6a0;
                    auVar24 = vfmadd132ps_fma(auVar131,auVar24,auVar90);
                    local_5e0 = vmovlps_avx(auVar24);
                    local_5d8 = vextractps_avx(auVar24,2);
                    local_5cc = (int)local_5a8;
                    local_5c8 = (int)local_728;
                    local_5c4 = (local_690.context)->instID[0];
                    local_5c0 = (local_690.context)->instPrimID[0];
                    local_7b4 = -1;
                    local_690.valid = &local_7b4;
                    local_690.geometryUserPtr = pGVar21->userPtr;
                    local_690.ray = (RTCRayN *)ray;
                    local_690.hit = (RTCHitN *)&local_5e0;
                    local_690.N = 1;
                    local_780._0_4_ = (int)uVar100;
                    local_7a0 = auVar101;
                    if (pGVar21->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_018cff64:
                      p_Var23 = context->args->filter;
                      if (p_Var23 == (RTCFilterFunctionN)0x0) break;
                      if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                         (((pGVar21->field_8).field_0x2 & 0x40) != 0)) {
                        auVar156 = ZEXT1664(auVar156._0_16_);
                        (*p_Var23)(&local_690);
                        uVar100 = (ulong)(uint)local_780._0_4_;
                        auVar200 = ZEXT3264(_local_4c0);
                        auVar205 = ZEXT3264(local_600);
                        auVar213 = ZEXT3264(local_6e0);
                        auVar209 = ZEXT3264(local_720);
                        auVar184 = ZEXT3264(CONCAT428(fStack_504,
                                                      CONCAT424(fStack_508,
                                                                CONCAT420(fStack_50c,
                                                                          CONCAT416(fStack_510,
                                                                                    CONCAT412(
                                                  fStack_514,
                                                  CONCAT48(fStack_518,CONCAT44(fStack_51c,local_520)
                                                          )))))));
                        auVar178 = ZEXT3264(local_620);
                        auVar174 = ZEXT3264(local_700);
                        ray = local_7a8;
                        context = local_7b0;
                        auVar101 = local_7a0;
                        pre = local_730;
                      }
                      if (*local_690.valid != 0) break;
                    }
                    else {
                      auVar156 = ZEXT1664(auVar150);
                      (*pGVar21->occlusionFilterN)(&local_690);
                      uVar100 = (ulong)(uint)local_780._0_4_;
                      auVar200 = ZEXT3264(_local_4c0);
                      auVar205 = ZEXT3264(local_600);
                      auVar213 = ZEXT3264(local_6e0);
                      auVar209 = ZEXT3264(local_720);
                      auVar184 = ZEXT3264(CONCAT428(fStack_504,
                                                    CONCAT424(fStack_508,
                                                              CONCAT420(fStack_50c,
                                                                        CONCAT416(fStack_510,
                                                                                  CONCAT412(
                                                  fStack_514,
                                                  CONCAT48(fStack_518,CONCAT44(fStack_51c,local_520)
                                                          )))))));
                      auVar178 = ZEXT3264(local_620);
                      auVar174 = ZEXT3264(local_700);
                      ray = local_7a8;
                      context = local_7b0;
                      auVar101 = local_7a0;
                      pre = local_730;
                      if (*local_690.valid != 0) goto LAB_018cff64;
                    }
                    ray->tfar = (float)local_5a0._0_4_;
                    lVar103 = 0;
                    auVar101 = (undefined1  [8])((ulong)auVar101 ^ 1L << (local_660._0_8_ & 0x3f));
                    for (uVar98 = (ulong)auVar101; (uVar98 & 1) == 0;
                        uVar98 = uVar98 >> 1 | 0x8000000000000000) {
                      lVar103 = lVar103 + 1;
                    }
                    uVar100 = CONCAT71((int7)(uVar100 >> 8),auVar101 != (undefined1  [8])0x0);
                  } while (auVar101 != (undefined1  [8])0x0);
                }
                uVar100 = uVar100 & 0xffffffffffffff01;
                auVar145 = ZEXT3264(local_6c0);
                fVar129 = (float)local_760._0_4_;
              }
            }
            auVar128 = ZEXT3264(local_640);
            goto LAB_018cfb7c;
          }
        }
        auVar205 = ZEXT3264(local_600);
        auVar174 = ZEXT3264(local_2e0);
        uVar100 = 0;
        auVar209 = ZEXT3264(local_720);
        auVar184 = ZEXT3264(auVar208);
        auVar178 = ZEXT3264(local_620);
        auVar145 = ZEXT3264(local_6c0);
        auVar128 = ZEXT3264(local_640);
        auVar200 = ZEXT3264(_local_4c0);
      }
LAB_018cfb7c:
      local_7a8 = ray;
      local_7b0 = context;
      local_730 = pre;
      if (8 < iVar20) {
        local_600 = auVar205._0_32_;
        local_400._4_4_ = iVar20;
        local_400._0_4_ = iVar20;
        fStack_3f8 = (float)iVar20;
        fStack_3f4 = (float)iVar20;
        fStack_3f0 = (float)iVar20;
        fStack_3ec = (float)iVar20;
        fStack_3e8 = (float)iVar20;
        iStack_3e4 = iVar20;
        local_360._4_4_ = fVar129;
        local_360._0_4_ = fVar129;
        fStack_358 = fVar129;
        fStack_354 = fVar129;
        fStack_350 = fVar129;
        fStack_34c = fVar129;
        fStack_348 = fVar129;
        fStack_344 = fVar129;
        local_120 = local_4a0._0_4_;
        uStack_11c = local_4a0._0_4_;
        uStack_118 = local_4a0._0_4_;
        uStack_114 = local_4a0._0_4_;
        uStack_110 = local_4a0._0_4_;
        uStack_10c = local_4a0._0_4_;
        uStack_108 = local_4a0._0_4_;
        uStack_104 = local_4a0._0_4_;
        local_140 = 1.0 / (float)local_3c0._0_4_;
        fStack_13c = local_140;
        fStack_138 = local_140;
        fStack_134 = local_140;
        fStack_130 = local_140;
        fStack_12c = local_140;
        fStack_128 = local_140;
        fStack_124 = local_140;
        lVar103 = 8;
        local_700 = auVar174._0_32_;
        _local_4c0 = auVar200._0_32_;
        do {
          local_760._0_32_ = *(undefined1 (*) [32])(bezier_basis0 + lVar103 * 4 + lVar27);
          auVar148 = *(undefined1 (*) [32])(lVar27 + 0x2227768 + lVar103 * 4);
          local_4a0 = *(undefined1 (*) [32])(lVar27 + 0x2227bec + lVar103 * 4);
          pauVar5 = (undefined1 (*) [28])(lVar27 + 0x2228070 + lVar103 * 4);
          auVar94 = *pauVar5;
          auVar201._0_4_ = local_580 * *(float *)*pauVar5;
          auVar201._4_4_ = fStack_57c * *(float *)(*pauVar5 + 4);
          auVar201._8_4_ = fStack_578 * *(float *)(*pauVar5 + 8);
          auVar201._12_4_ = fStack_574 * *(float *)(*pauVar5 + 0xc);
          auVar201._16_4_ = fStack_570 * *(float *)(*pauVar5 + 0x10);
          auVar201._20_4_ = fStack_56c * *(float *)(*pauVar5 + 0x14);
          auVar201._28_36_ = auVar200._28_36_;
          auVar201._24_4_ = fStack_568 * *(float *)(*pauVar5 + 0x18);
          fVar179 = auVar184._0_4_;
          auVar200._0_4_ = fVar179 * *(float *)*pauVar5;
          fVar185 = auVar184._4_4_;
          auVar200._4_4_ = fVar185 * *(float *)(*pauVar5 + 4);
          fVar186 = auVar184._8_4_;
          auVar200._8_4_ = fVar186 * *(float *)(*pauVar5 + 8);
          fVar187 = auVar184._12_4_;
          auVar200._12_4_ = fVar187 * *(float *)(*pauVar5 + 0xc);
          fVar188 = auVar184._16_4_;
          auVar200._16_4_ = fVar188 * *(float *)(*pauVar5 + 0x10);
          fVar189 = auVar184._20_4_;
          auVar200._20_4_ = fVar189 * *(float *)(*pauVar5 + 0x14);
          auVar200._28_36_ = auVar156._28_36_;
          fVar190 = auVar184._24_4_;
          auVar200._24_4_ = fVar190 * *(float *)(*pauVar5 + 0x18);
          auVar24 = vfmadd231ps_fma(auVar201._0_32_,local_4a0,auVar145._0_32_);
          auVar11 = vfmadd231ps_fma(auVar200._0_32_,local_4a0,auVar178._0_32_);
          auVar24 = vfmadd231ps_fma(ZEXT1632(auVar24),auVar148,auVar209._0_32_);
          auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar148,auVar128._0_32_);
          auVar24 = vfmadd231ps_fma(ZEXT1632(auVar24),local_760._0_32_,auVar213._0_32_);
          auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),local_760._0_32_,local_3e0);
          auVar25 = *(undefined1 (*) [32])(bezier_basis1 + lVar103 * 4 + lVar27);
          auVar170 = *(undefined1 (*) [32])(lVar27 + 0x2229b88 + lVar103 * 4);
          auVar114 = *(undefined1 (*) [32])(lVar27 + 0x222a00c + lVar103 * 4);
          pfVar6 = (float *)(lVar27 + 0x222a490 + lVar103 * 4);
          fVar162 = *pfVar6;
          fVar196 = pfVar6[1];
          fVar202 = pfVar6[2];
          fVar86 = pfVar6[3];
          fVar87 = pfVar6[4];
          fVar88 = pfVar6[5];
          fVar89 = pfVar6[6];
          auVar206._0_4_ = fVar162 * local_580;
          auVar206._4_4_ = fVar196 * fStack_57c;
          auVar206._8_4_ = fVar202 * fStack_578;
          auVar206._12_4_ = fVar86 * fStack_574;
          auVar206._16_4_ = fVar87 * fStack_570;
          auVar206._20_4_ = fVar88 * fStack_56c;
          auVar206._28_36_ = auVar205._28_36_;
          auVar206._24_4_ = fVar89 * fStack_568;
          auVar56._4_4_ = fVar185 * fVar196;
          auVar56._0_4_ = fVar179 * fVar162;
          auVar56._8_4_ = fVar186 * fVar202;
          auVar56._12_4_ = fVar187 * fVar86;
          auVar56._16_4_ = fVar188 * fVar87;
          auVar56._20_4_ = fVar189 * fVar88;
          auVar56._24_4_ = fVar190 * fVar89;
          auVar56._28_4_ = local_760._28_4_;
          auVar12 = vfmadd231ps_fma(auVar206._0_32_,auVar114,auVar145._0_32_);
          auVar13 = vfmadd231ps_fma(auVar56,auVar114,auVar178._0_32_);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar170,auVar209._0_32_);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar170,auVar128._0_32_);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar25,auVar213._0_32_);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar25,local_3e0);
          auVar120 = ZEXT1632(auVar12);
          auVar108 = ZEXT1632(auVar24);
          auVar183 = vsubps_avx(auVar120,auVar108);
          auVar138 = ZEXT1632(auVar13);
          auVar134 = ZEXT1632(auVar11);
          auVar26 = vsubps_avx(auVar138,auVar134);
          auVar57._4_4_ = auVar183._4_4_ * auVar11._4_4_;
          auVar57._0_4_ = auVar183._0_4_ * auVar11._0_4_;
          auVar57._8_4_ = auVar183._8_4_ * auVar11._8_4_;
          auVar57._12_4_ = auVar183._12_4_ * auVar11._12_4_;
          auVar57._16_4_ = auVar183._16_4_ * 0.0;
          auVar57._20_4_ = auVar183._20_4_ * 0.0;
          auVar57._24_4_ = auVar183._24_4_ * 0.0;
          auVar57._28_4_ = auVar178._28_4_;
          fVar129 = auVar26._0_4_;
          auVar205._0_4_ = auVar24._0_4_ * fVar129;
          fVar117 = auVar26._4_4_;
          auVar205._4_4_ = auVar24._4_4_ * fVar117;
          fVar157 = auVar26._8_4_;
          auVar205._8_4_ = auVar24._8_4_ * fVar157;
          fVar158 = auVar26._12_4_;
          auVar205._12_4_ = auVar24._12_4_ * fVar158;
          fVar159 = auVar26._16_4_;
          auVar205._16_4_ = fVar159 * 0.0;
          fVar160 = auVar26._20_4_;
          auVar205._20_4_ = fVar160 * 0.0;
          fVar161 = auVar26._24_4_;
          auVar205._28_36_ = auVar128._28_36_;
          auVar205._24_4_ = fVar161 * 0.0;
          auVar200 = ZEXT3264(local_4a0);
          auVar116 = vsubps_avx(auVar57,auVar205._0_32_);
          local_7a0._0_4_ = auVar94._0_4_;
          local_7a0._4_4_ = auVar94._4_4_;
          fStack_798 = auVar94._8_4_;
          fStack_794 = auVar94._12_4_;
          fStack_790 = auVar94._16_4_;
          fStack_78c = auVar94._20_4_;
          fStack_788 = auVar94._24_4_;
          auVar58._4_4_ = local_100._4_4_ * (float)local_7a0._4_4_;
          auVar58._0_4_ = (float)local_100 * (float)local_7a0._0_4_;
          auVar58._8_4_ = (float)uStack_f8 * fStack_798;
          auVar58._12_4_ = uStack_f8._4_4_ * fStack_794;
          auVar58._16_4_ = (float)uStack_f0 * fStack_790;
          auVar58._20_4_ = uStack_f0._4_4_ * fStack_78c;
          auVar58._24_4_ = (float)uStack_e8 * fStack_788;
          auVar58._28_4_ = auVar128._28_4_;
          auVar156 = ZEXT3264(auVar170);
          auVar24 = vfmadd231ps_fma(auVar58,local_4a0,local_e0);
          auVar24 = vfmadd231ps_fma(ZEXT1632(auVar24),local_c0,auVar148);
          auVar24 = vfmadd231ps_fma(ZEXT1632(auVar24),local_a0,local_760._0_32_);
          auVar59._4_4_ = local_100._4_4_ * fVar196;
          auVar59._0_4_ = (float)local_100 * fVar162;
          auVar59._8_4_ = (float)uStack_f8 * fVar202;
          auVar59._12_4_ = uStack_f8._4_4_ * fVar86;
          auVar59._16_4_ = (float)uStack_f0 * fVar87;
          auVar59._20_4_ = uStack_f0._4_4_ * fVar88;
          auVar59._24_4_ = (float)uStack_e8 * fVar89;
          auVar59._28_4_ = uStack_e8._4_4_;
          auVar11 = vfmadd231ps_fma(auVar59,auVar114,local_e0);
          auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar170,local_c0);
          auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar25,local_a0);
          auVar205 = ZEXT1664(auVar11);
          auVar213._0_4_ = fVar129 * fVar129;
          auVar213._4_4_ = fVar117 * fVar117;
          auVar213._8_4_ = fVar157 * fVar157;
          auVar213._12_4_ = fVar158 * fVar158;
          auVar213._16_4_ = fVar159 * fVar159;
          auVar213._20_4_ = fVar160 * fVar160;
          auVar213._28_36_ = auVar184._28_36_;
          auVar213._24_4_ = fVar161 * fVar161;
          auVar14 = vfmadd231ps_fma(auVar213._0_32_,auVar183,auVar183);
          _local_440 = ZEXT1632(auVar24);
          auVar135 = ZEXT1632(auVar11);
          auVar125 = vmaxps_avx(_local_440,auVar135);
          auVar181._0_4_ = auVar125._0_4_ * auVar125._0_4_ * auVar14._0_4_;
          auVar181._4_4_ = auVar125._4_4_ * auVar125._4_4_ * auVar14._4_4_;
          auVar181._8_4_ = auVar125._8_4_ * auVar125._8_4_ * auVar14._8_4_;
          auVar181._12_4_ = auVar125._12_4_ * auVar125._12_4_ * auVar14._12_4_;
          auVar181._16_4_ = auVar125._16_4_ * auVar125._16_4_ * 0.0;
          auVar181._20_4_ = auVar125._20_4_ * auVar125._20_4_ * 0.0;
          auVar181._24_4_ = auVar125._24_4_ * auVar125._24_4_ * 0.0;
          auVar181._28_4_ = 0;
          auVar60._4_4_ = auVar116._4_4_ * auVar116._4_4_;
          auVar60._0_4_ = auVar116._0_4_ * auVar116._0_4_;
          auVar60._8_4_ = auVar116._8_4_ * auVar116._8_4_;
          auVar60._12_4_ = auVar116._12_4_ * auVar116._12_4_;
          auVar60._16_4_ = auVar116._16_4_ * auVar116._16_4_;
          auVar60._20_4_ = auVar116._20_4_ * auVar116._20_4_;
          auVar60._24_4_ = auVar116._24_4_ * auVar116._24_4_;
          auVar60._28_4_ = auVar116._28_4_;
          auVar125 = vcmpps_avx(auVar60,auVar181,2);
          local_2c0 = (int)lVar103;
          auVar182._4_4_ = local_2c0;
          auVar182._0_4_ = local_2c0;
          auVar182._8_4_ = local_2c0;
          auVar182._12_4_ = local_2c0;
          auVar182._16_4_ = local_2c0;
          auVar182._20_4_ = local_2c0;
          auVar182._24_4_ = local_2c0;
          auVar182._28_4_ = local_2c0;
          auVar116 = vpor_avx2(auVar182,_DAT_0205a920);
          auVar119 = vpcmpgtd_avx2(_local_400,auVar116);
          auVar116 = auVar119 & auVar125;
          if ((((((((auVar116 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar116 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar116 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar116 >> 0x7f,0) == '\0') &&
                (auVar116 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar116 >> 0xbf,0) == '\0') &&
              (auVar116 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar116[0x1f]) {
            auVar128 = ZEXT3264(local_640);
            auVar145 = ZEXT3264(local_6c0);
            auVar178 = ZEXT3264(local_620);
            auVar184 = ZEXT3264(auVar184._0_32_);
            auVar209 = ZEXT3264(local_720);
            auVar213 = ZEXT3264(local_6e0);
            auVar174 = ZEXT3264(local_700);
          }
          else {
            local_3c0 = vandps_avx(auVar119,auVar125);
            auVar61._4_4_ = fVar196 * (float)local_4c0._4_4_;
            auVar61._0_4_ = fVar162 * (float)local_4c0._0_4_;
            auVar61._8_4_ = fVar202 * fStack_4b8;
            auVar61._12_4_ = fVar86 * fStack_4b4;
            auVar61._16_4_ = fVar87 * fStack_4b0;
            auVar61._20_4_ = fVar88 * fStack_4ac;
            auVar61._24_4_ = fVar89 * fStack_4a8;
            auVar61._28_4_ = auVar125._28_4_;
            auVar24 = vfmadd213ps_fma(auVar114,local_160,auVar61);
            auVar24 = vfmadd213ps_fma(auVar170,local_600,ZEXT1632(auVar24));
            auVar24 = vfmadd132ps_fma(auVar25,ZEXT1632(auVar24),local_420);
            auVar62._4_4_ = (float)local_4c0._4_4_ * (float)local_7a0._4_4_;
            auVar62._0_4_ = (float)local_4c0._0_4_ * (float)local_7a0._0_4_;
            auVar62._8_4_ = fStack_4b8 * fStack_798;
            auVar62._12_4_ = fStack_4b4 * fStack_794;
            auVar62._16_4_ = fStack_4b0 * fStack_790;
            auVar62._20_4_ = fStack_4ac * fStack_78c;
            auVar62._24_4_ = fStack_4a8 * fStack_788;
            auVar62._28_4_ = auVar125._28_4_;
            auVar14 = vfmadd213ps_fma(local_4a0,local_160,auVar62);
            auVar14 = vfmadd213ps_fma(auVar148,local_600,ZEXT1632(auVar14));
            auVar148 = *(undefined1 (*) [32])(lVar27 + 0x22284f4 + lVar103 * 4);
            auVar25 = *(undefined1 (*) [32])(lVar27 + 0x2228978 + lVar103 * 4);
            auVar170 = *(undefined1 (*) [32])(lVar27 + 0x2228dfc + lVar103 * 4);
            pfVar7 = (float *)(lVar27 + 0x2229280 + lVar103 * 4);
            fVar129 = *pfVar7;
            fVar117 = pfVar7[1];
            fVar157 = pfVar7[2];
            fVar158 = pfVar7[3];
            fVar159 = pfVar7[4];
            fVar160 = pfVar7[5];
            fVar161 = pfVar7[6];
            auVar63._4_4_ = fVar117 * fStack_57c;
            auVar63._0_4_ = fVar129 * local_580;
            auVar63._8_4_ = fVar157 * fStack_578;
            auVar63._12_4_ = fVar158 * fStack_574;
            auVar63._16_4_ = fVar159 * fStack_570;
            auVar63._20_4_ = fVar160 * fStack_56c;
            auVar63._24_4_ = fVar161 * fStack_568;
            auVar63._28_4_ = pfVar6[7];
            auVar198._0_4_ = fVar129 * fVar179;
            auVar198._4_4_ = fVar117 * fVar185;
            auVar198._8_4_ = fVar157 * fVar186;
            auVar198._12_4_ = fVar158 * fVar187;
            auVar198._16_4_ = fVar159 * fVar188;
            auVar198._20_4_ = fVar160 * fVar189;
            auVar198._24_4_ = fVar161 * fVar190;
            auVar198._28_4_ = 0;
            auVar64._4_4_ = fVar117 * (float)local_4c0._4_4_;
            auVar64._0_4_ = fVar129 * (float)local_4c0._0_4_;
            auVar64._8_4_ = fVar157 * fStack_4b8;
            auVar64._12_4_ = fVar158 * fStack_4b4;
            auVar64._16_4_ = fVar159 * fStack_4b0;
            auVar64._20_4_ = fVar160 * fStack_4ac;
            auVar64._24_4_ = fVar161 * fStack_4a8;
            auVar64._28_4_ = pfVar7[7];
            auVar15 = vfmadd231ps_fma(auVar63,auVar170,local_6c0);
            auVar16 = vfmadd231ps_fma(auVar198,auVar170,local_620);
            auVar17 = vfmadd231ps_fma(auVar64,local_160,auVar170);
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar25,local_720);
            auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar25,local_640);
            auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),local_600,auVar25);
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar148,local_6e0);
            auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar148,local_3e0);
            auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar148,local_420);
            pfVar6 = (float *)(lVar27 + 0x222b6a0 + lVar103 * 4);
            fVar129 = *pfVar6;
            fVar117 = pfVar6[1];
            fVar157 = pfVar6[2];
            fVar158 = pfVar6[3];
            fVar159 = pfVar6[4];
            fVar160 = pfVar6[5];
            fVar161 = pfVar6[6];
            local_4a0 = auVar183;
            auVar65._4_4_ = fStack_57c * fVar117;
            auVar65._0_4_ = local_580 * fVar129;
            auVar65._8_4_ = fStack_578 * fVar157;
            auVar65._12_4_ = fStack_574 * fVar158;
            auVar65._16_4_ = fStack_570 * fVar159;
            auVar65._20_4_ = fStack_56c * fVar160;
            auVar65._24_4_ = fStack_568 * fVar161;
            auVar65._28_4_ = auVar183._28_4_;
            auVar66._4_4_ = fVar185 * fVar117;
            auVar66._0_4_ = fVar179 * fVar129;
            auVar66._8_4_ = fVar186 * fVar157;
            auVar66._12_4_ = fVar187 * fVar158;
            auVar66._16_4_ = fVar188 * fVar159;
            auVar66._20_4_ = fVar189 * fVar160;
            auVar66._24_4_ = fVar190 * fVar161;
            auVar66._28_4_ = auVar26._28_4_;
            auVar67._4_4_ = fVar117 * (float)local_4c0._4_4_;
            auVar67._0_4_ = fVar129 * (float)local_4c0._0_4_;
            auVar67._8_4_ = fVar157 * fStack_4b8;
            auVar67._12_4_ = fVar158 * fStack_4b4;
            auVar67._16_4_ = fVar159 * fStack_4b0;
            auVar67._20_4_ = fVar160 * fStack_4ac;
            auVar67._24_4_ = fVar161 * fStack_4a8;
            auVar67._28_4_ = pfVar6[7];
            auVar148 = *(undefined1 (*) [32])(lVar27 + 0x222b21c + lVar103 * 4);
            auVar18 = vfmadd231ps_fma(auVar65,auVar148,local_6c0);
            auVar106 = vfmadd231ps_fma(auVar66,auVar148,local_620);
            auVar163 = vfmadd231ps_fma(auVar67,local_160,auVar148);
            auVar148 = *(undefined1 (*) [32])(lVar27 + 0x222ad98 + lVar103 * 4);
            auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar148,local_720);
            auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar148,local_640);
            auVar163 = vfmadd231ps_fma(ZEXT1632(auVar163),auVar148,local_600);
            auVar148 = *(undefined1 (*) [32])(lVar27 + 0x222a914 + lVar103 * 4);
            auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar148,local_6e0);
            auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar148,local_3e0);
            auVar163 = vfmadd231ps_fma(ZEXT1632(auVar163),local_420,auVar148);
            auVar148 = vandps_avx(ZEXT1632(auVar15),local_1a0);
            auVar25 = vandps_avx(ZEXT1632(auVar16),local_1a0);
            auVar25 = vmaxps_avx(auVar148,auVar25);
            auVar148 = vandps_avx(ZEXT1632(auVar17),local_1a0);
            auVar148 = vmaxps_avx(auVar25,auVar148);
            auVar148 = vcmpps_avx(auVar148,_local_360,1);
            auVar170 = vblendvps_avx(ZEXT1632(auVar15),auVar183,auVar148);
            auVar114 = vblendvps_avx(ZEXT1632(auVar16),auVar26,auVar148);
            auVar148 = vandps_avx(ZEXT1632(auVar18),local_1a0);
            auVar25 = vandps_avx(ZEXT1632(auVar106),local_1a0);
            auVar25 = vmaxps_avx(auVar148,auVar25);
            auVar148 = vandps_avx(local_1a0,ZEXT1632(auVar163));
            auVar148 = vmaxps_avx(auVar25,auVar148);
            auVar25 = vcmpps_avx(auVar148,_local_360,1);
            auVar148 = vblendvps_avx(ZEXT1632(auVar18),auVar183,auVar25);
            auVar25 = vblendvps_avx(ZEXT1632(auVar106),auVar26,auVar25);
            auVar14 = vfmadd213ps_fma(local_760._0_32_,local_420,ZEXT1632(auVar14));
            auVar15 = vfmadd213ps_fma(auVar170,auVar170,ZEXT832(0) << 0x20);
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar114,auVar114);
            auVar125 = vrsqrtps_avx(ZEXT1632(auVar15));
            fVar129 = auVar125._0_4_;
            fVar117 = auVar125._4_4_;
            fVar157 = auVar125._8_4_;
            fVar158 = auVar125._12_4_;
            fVar159 = auVar125._16_4_;
            fVar160 = auVar125._20_4_;
            fVar161 = auVar125._24_4_;
            auVar68._4_4_ = fVar117 * fVar117 * fVar117 * auVar15._4_4_ * -0.5;
            auVar68._0_4_ = fVar129 * fVar129 * fVar129 * auVar15._0_4_ * -0.5;
            auVar68._8_4_ = fVar157 * fVar157 * fVar157 * auVar15._8_4_ * -0.5;
            auVar68._12_4_ = fVar158 * fVar158 * fVar158 * auVar15._12_4_ * -0.5;
            auVar68._16_4_ = fVar159 * fVar159 * fVar159 * -0.0;
            auVar68._20_4_ = fVar160 * fVar160 * fVar160 * -0.0;
            auVar68._24_4_ = fVar161 * fVar161 * fVar161 * -0.0;
            auVar68._28_4_ = 0;
            auVar149._8_4_ = 0x3fc00000;
            auVar149._0_8_ = 0x3fc000003fc00000;
            auVar149._12_4_ = 0x3fc00000;
            auVar149._16_4_ = 0x3fc00000;
            auVar149._20_4_ = 0x3fc00000;
            auVar149._24_4_ = 0x3fc00000;
            auVar149._28_4_ = 0x3fc00000;
            auVar15 = vfmadd231ps_fma(auVar68,auVar149,auVar125);
            fVar129 = auVar15._0_4_;
            fVar117 = auVar15._4_4_;
            auVar69._4_4_ = auVar114._4_4_ * fVar117;
            auVar69._0_4_ = auVar114._0_4_ * fVar129;
            fVar157 = auVar15._8_4_;
            auVar69._8_4_ = auVar114._8_4_ * fVar157;
            fVar158 = auVar15._12_4_;
            auVar69._12_4_ = auVar114._12_4_ * fVar158;
            auVar69._16_4_ = auVar114._16_4_ * 0.0;
            auVar69._20_4_ = auVar114._20_4_ * 0.0;
            auVar69._24_4_ = auVar114._24_4_ * 0.0;
            auVar69._28_4_ = auVar114._28_4_;
            auVar70._4_4_ = fVar117 * -auVar170._4_4_;
            auVar70._0_4_ = fVar129 * -auVar170._0_4_;
            auVar70._8_4_ = fVar157 * -auVar170._8_4_;
            auVar70._12_4_ = fVar158 * -auVar170._12_4_;
            auVar70._16_4_ = -auVar170._16_4_ * 0.0;
            auVar70._20_4_ = -auVar170._20_4_ * 0.0;
            auVar70._24_4_ = -auVar170._24_4_ * 0.0;
            auVar70._28_4_ = auVar125._28_4_;
            auVar15 = vfmadd213ps_fma(auVar148,auVar148,ZEXT832(0) << 0x20);
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar25,auVar25);
            auVar170 = vrsqrtps_avx(ZEXT1632(auVar15));
            auVar71._28_4_ = local_3e0._28_4_;
            auVar71._0_28_ =
                 ZEXT1628(CONCAT412(fVar158 * 0.0,
                                    CONCAT48(fVar157 * 0.0,CONCAT44(fVar117 * 0.0,fVar129 * 0.0))));
            fVar129 = auVar170._0_4_;
            fVar117 = auVar170._4_4_;
            fVar157 = auVar170._8_4_;
            fVar158 = auVar170._12_4_;
            fVar159 = auVar170._16_4_;
            fVar160 = auVar170._20_4_;
            fVar161 = auVar170._24_4_;
            auVar72._4_4_ = fVar117 * fVar117 * fVar117 * auVar15._4_4_ * -0.5;
            auVar72._0_4_ = fVar129 * fVar129 * fVar129 * auVar15._0_4_ * -0.5;
            auVar72._8_4_ = fVar157 * fVar157 * fVar157 * auVar15._8_4_ * -0.5;
            auVar72._12_4_ = fVar158 * fVar158 * fVar158 * auVar15._12_4_ * -0.5;
            auVar72._16_4_ = fVar159 * fVar159 * fVar159 * -0.0;
            auVar72._20_4_ = fVar160 * fVar160 * fVar160 * -0.0;
            auVar72._24_4_ = fVar161 * fVar161 * fVar161 * -0.0;
            auVar72._28_4_ = 0;
            auVar15 = vfmadd231ps_fma(auVar72,auVar149,auVar170);
            fVar129 = auVar15._0_4_;
            fVar117 = auVar15._4_4_;
            auVar73._4_4_ = auVar25._4_4_ * fVar117;
            auVar73._0_4_ = auVar25._0_4_ * fVar129;
            fVar157 = auVar15._8_4_;
            auVar73._8_4_ = auVar25._8_4_ * fVar157;
            fVar158 = auVar15._12_4_;
            auVar73._12_4_ = auVar25._12_4_ * fVar158;
            auVar73._16_4_ = auVar25._16_4_ * 0.0;
            auVar73._20_4_ = auVar25._20_4_ * 0.0;
            auVar73._24_4_ = auVar25._24_4_ * 0.0;
            auVar73._28_4_ = 0;
            auVar74._4_4_ = fVar117 * -auVar148._4_4_;
            auVar74._0_4_ = fVar129 * -auVar148._0_4_;
            auVar74._8_4_ = fVar157 * -auVar148._8_4_;
            auVar74._12_4_ = fVar158 * -auVar148._12_4_;
            auVar74._16_4_ = -auVar148._16_4_ * 0.0;
            auVar74._20_4_ = -auVar148._20_4_ * 0.0;
            auVar74._24_4_ = -auVar148._24_4_ * 0.0;
            auVar74._28_4_ = 0;
            auVar75._28_4_ = 0xbf000000;
            auVar75._0_28_ =
                 ZEXT1628(CONCAT412(fVar158 * 0.0,
                                    CONCAT48(fVar157 * 0.0,CONCAT44(fVar117 * 0.0,fVar129 * 0.0))));
            auVar15 = vfmadd213ps_fma(auVar69,_local_440,auVar108);
            auVar16 = vfmadd213ps_fma(auVar70,_local_440,auVar134);
            auVar17 = vfmadd213ps_fma(auVar71,_local_440,ZEXT1632(auVar14));
            auVar29 = vfnmadd213ps_fma(auVar69,_local_440,auVar108);
            auVar18 = vfmadd213ps_fma(auVar73,auVar135,auVar120);
            auVar146 = vfnmadd213ps_fma(auVar70,_local_440,auVar134);
            auVar106 = vfmadd213ps_fma(auVar74,auVar135,auVar138);
            auVar172 = vfnmadd231ps_fma(ZEXT1632(auVar14),_local_440,auVar71);
            auVar14 = vfmadd213ps_fma(auVar75,auVar135,ZEXT1632(auVar24));
            auVar164 = vfnmadd213ps_fma(auVar73,auVar135,auVar120);
            auVar165 = vfnmadd213ps_fma(auVar74,auVar135,auVar138);
            auVar173 = vfnmadd231ps_fma(ZEXT1632(auVar24),auVar135,auVar75);
            auVar148 = vsubps_avx(ZEXT1632(auVar106),ZEXT1632(auVar146));
            auVar25 = vsubps_avx(ZEXT1632(auVar14),ZEXT1632(auVar172));
            auVar76._4_4_ = auVar148._4_4_ * auVar172._4_4_;
            auVar76._0_4_ = auVar148._0_4_ * auVar172._0_4_;
            auVar76._8_4_ = auVar148._8_4_ * auVar172._8_4_;
            auVar76._12_4_ = auVar148._12_4_ * auVar172._12_4_;
            auVar76._16_4_ = auVar148._16_4_ * 0.0;
            auVar76._20_4_ = auVar148._20_4_ * 0.0;
            auVar76._24_4_ = auVar148._24_4_ * 0.0;
            auVar76._28_4_ = 0;
            auVar163 = vfmsub231ps_fma(auVar76,ZEXT1632(auVar146),auVar25);
            auVar77._4_4_ = auVar29._4_4_ * auVar25._4_4_;
            auVar77._0_4_ = auVar29._0_4_ * auVar25._0_4_;
            auVar77._8_4_ = auVar29._8_4_ * auVar25._8_4_;
            auVar77._12_4_ = auVar29._12_4_ * auVar25._12_4_;
            auVar77._16_4_ = auVar25._16_4_ * 0.0;
            auVar77._20_4_ = auVar25._20_4_ * 0.0;
            auVar77._24_4_ = auVar25._24_4_ * 0.0;
            auVar77._28_4_ = auVar25._28_4_;
            auVar183 = ZEXT1632(auVar29);
            auVar25 = vsubps_avx(ZEXT1632(auVar18),auVar183);
            auVar116 = ZEXT1632(auVar172);
            auVar24 = vfmsub231ps_fma(auVar77,auVar116,auVar25);
            auVar78._4_4_ = auVar146._4_4_ * auVar25._4_4_;
            auVar78._0_4_ = auVar146._0_4_ * auVar25._0_4_;
            auVar78._8_4_ = auVar146._8_4_ * auVar25._8_4_;
            auVar78._12_4_ = auVar146._12_4_ * auVar25._12_4_;
            auVar78._16_4_ = auVar25._16_4_ * 0.0;
            auVar78._20_4_ = auVar25._20_4_ * 0.0;
            auVar78._24_4_ = auVar25._24_4_ * 0.0;
            auVar78._28_4_ = auVar25._28_4_;
            auVar29 = vfmsub231ps_fma(auVar78,auVar183,auVar148);
            auVar24 = vfmadd231ps_fma(ZEXT1632(auVar29),ZEXT832(0) << 0x20,ZEXT1632(auVar24));
            auVar24 = vfmadd231ps_fma(ZEXT1632(auVar24),ZEXT832(0) << 0x20,ZEXT1632(auVar163));
            auVar119 = vcmpps_avx(ZEXT1632(auVar24),ZEXT832(0) << 0x20,2);
            auVar148 = vblendvps_avx(ZEXT1632(auVar164),ZEXT1632(auVar15),auVar119);
            auVar25 = vblendvps_avx(ZEXT1632(auVar165),ZEXT1632(auVar16),auVar119);
            local_760._0_32_ = vblendvps_avx(ZEXT1632(auVar173),ZEXT1632(auVar17),auVar119);
            auVar170 = vblendvps_avx(auVar183,ZEXT1632(auVar18),auVar119);
            auVar114 = vblendvps_avx(ZEXT1632(auVar146),ZEXT1632(auVar106),auVar119);
            auVar125 = vblendvps_avx(auVar116,ZEXT1632(auVar14),auVar119);
            auVar183 = vblendvps_avx(ZEXT1632(auVar18),auVar183,auVar119);
            auVar26 = vblendvps_avx(ZEXT1632(auVar106),ZEXT1632(auVar146),auVar119);
            auVar24 = vpackssdw_avx(local_3c0._0_16_,local_3c0._16_16_);
            auVar116 = vblendvps_avx(ZEXT1632(auVar14),auVar116,auVar119);
            auVar183 = vsubps_avx(auVar183,auVar148);
            auVar26 = vsubps_avx(auVar26,auVar25);
            auVar138 = vsubps_avx(auVar116,local_760._0_32_);
            auVar200 = ZEXT3264(auVar138);
            auVar134 = vsubps_avx(auVar148,auVar170);
            auVar108 = vsubps_avx(auVar25,auVar114);
            auVar120 = vsubps_avx(local_760._0_32_,auVar125);
            auVar205 = ZEXT3264(auVar120);
            auVar153._0_4_ = auVar138._0_4_ * auVar148._0_4_;
            auVar153._4_4_ = auVar138._4_4_ * auVar148._4_4_;
            auVar153._8_4_ = auVar138._8_4_ * auVar148._8_4_;
            auVar153._12_4_ = auVar138._12_4_ * auVar148._12_4_;
            auVar153._16_4_ = auVar138._16_4_ * auVar148._16_4_;
            auVar153._20_4_ = auVar138._20_4_ * auVar148._20_4_;
            auVar153._24_4_ = auVar138._24_4_ * auVar148._24_4_;
            auVar153._28_4_ = 0;
            auVar14 = vfmsub231ps_fma(auVar153,local_760._0_32_,auVar183);
            auVar79._4_4_ = auVar183._4_4_ * auVar25._4_4_;
            auVar79._0_4_ = auVar183._0_4_ * auVar25._0_4_;
            auVar79._8_4_ = auVar183._8_4_ * auVar25._8_4_;
            auVar79._12_4_ = auVar183._12_4_ * auVar25._12_4_;
            auVar79._16_4_ = auVar183._16_4_ * auVar25._16_4_;
            auVar79._20_4_ = auVar183._20_4_ * auVar25._20_4_;
            auVar79._24_4_ = auVar183._24_4_ * auVar25._24_4_;
            auVar79._28_4_ = auVar116._28_4_;
            auVar15 = vfmsub231ps_fma(auVar79,auVar148,auVar26);
            auVar14 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT1632(auVar14),_DAT_02020f00);
            auVar154._0_4_ = local_760._0_4_ * auVar26._0_4_;
            auVar154._4_4_ = local_760._4_4_ * auVar26._4_4_;
            auVar154._8_4_ = local_760._8_4_ * auVar26._8_4_;
            auVar154._12_4_ = local_760._12_4_ * auVar26._12_4_;
            auVar154._16_4_ = local_760._16_4_ * auVar26._16_4_;
            auVar154._20_4_ = local_760._20_4_ * auVar26._20_4_;
            auVar154._24_4_ = local_760._24_4_ * auVar26._24_4_;
            auVar154._28_4_ = 0;
            auVar15 = vfmsub231ps_fma(auVar154,auVar25,auVar138);
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
            auVar155._0_4_ = auVar120._0_4_ * auVar170._0_4_;
            auVar155._4_4_ = auVar120._4_4_ * auVar170._4_4_;
            auVar155._8_4_ = auVar120._8_4_ * auVar170._8_4_;
            auVar155._12_4_ = auVar120._12_4_ * auVar170._12_4_;
            auVar155._16_4_ = auVar120._16_4_ * auVar170._16_4_;
            auVar155._20_4_ = auVar120._20_4_ * auVar170._20_4_;
            auVar155._24_4_ = auVar120._24_4_ * auVar170._24_4_;
            auVar155._28_4_ = 0;
            auVar14 = vfmsub231ps_fma(auVar155,auVar134,auVar125);
            auVar80._4_4_ = auVar108._4_4_ * auVar125._4_4_;
            auVar80._0_4_ = auVar108._0_4_ * auVar125._0_4_;
            auVar80._8_4_ = auVar108._8_4_ * auVar125._8_4_;
            auVar80._12_4_ = auVar108._12_4_ * auVar125._12_4_;
            auVar80._16_4_ = auVar108._16_4_ * auVar125._16_4_;
            auVar80._20_4_ = auVar108._20_4_ * auVar125._20_4_;
            auVar80._24_4_ = auVar108._24_4_ * auVar125._24_4_;
            auVar80._28_4_ = auVar125._28_4_;
            auVar16 = vfmsub231ps_fma(auVar80,auVar114,auVar120);
            auVar81._4_4_ = auVar134._4_4_ * auVar114._4_4_;
            auVar81._0_4_ = auVar134._0_4_ * auVar114._0_4_;
            auVar81._8_4_ = auVar134._8_4_ * auVar114._8_4_;
            auVar81._12_4_ = auVar134._12_4_ * auVar114._12_4_;
            auVar81._16_4_ = auVar134._16_4_ * auVar114._16_4_;
            auVar81._20_4_ = auVar134._20_4_ * auVar114._20_4_;
            auVar81._24_4_ = auVar134._24_4_ * auVar114._24_4_;
            auVar81._28_4_ = auVar114._28_4_;
            auVar17 = vfmsub231ps_fma(auVar81,auVar108,auVar170);
            auVar14 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
            auVar16 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT832(0) << 0x20,ZEXT1632(auVar16));
            auVar170 = vmaxps_avx(ZEXT1632(auVar15),ZEXT1632(auVar16));
            auVar170 = vcmpps_avx(auVar170,ZEXT832(0) << 0x20,2);
            auVar14 = vpackssdw_avx(auVar170._0_16_,auVar170._16_16_);
            auVar24 = vpand_avx(auVar24,auVar14);
            auVar170 = vpmovsxwd_avx2(auVar24);
            auVar156 = ZEXT3264(auVar170);
            if ((((((((auVar170 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar170 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar170 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar170 >> 0x7f,0) == '\0') &&
                  (auVar170 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar170 >> 0xbf,0) == '\0') &&
                (auVar170 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar170[0x1f]) {
LAB_018d0dc2:
              auVar144._8_8_ = uStack_458;
              auVar144._0_8_ = local_460;
              auVar144._16_8_ = uStack_450;
              auVar144._24_8_ = uStack_448;
            }
            else {
              auVar82._4_4_ = auVar120._4_4_ * auVar26._4_4_;
              auVar82._0_4_ = auVar120._0_4_ * auVar26._0_4_;
              auVar82._8_4_ = auVar120._8_4_ * auVar26._8_4_;
              auVar82._12_4_ = auVar120._12_4_ * auVar26._12_4_;
              auVar82._16_4_ = auVar120._16_4_ * auVar26._16_4_;
              auVar82._20_4_ = auVar120._20_4_ * auVar26._20_4_;
              auVar82._24_4_ = auVar120._24_4_ * auVar26._24_4_;
              auVar82._28_4_ = auVar170._28_4_;
              auVar106 = vfmsub231ps_fma(auVar82,auVar108,auVar138);
              auVar171._0_4_ = auVar138._0_4_ * auVar134._0_4_;
              auVar171._4_4_ = auVar138._4_4_ * auVar134._4_4_;
              auVar171._8_4_ = auVar138._8_4_ * auVar134._8_4_;
              auVar171._12_4_ = auVar138._12_4_ * auVar134._12_4_;
              auVar171._16_4_ = auVar138._16_4_ * auVar134._16_4_;
              auVar171._20_4_ = auVar138._20_4_ * auVar134._20_4_;
              auVar171._24_4_ = auVar138._24_4_ * auVar134._24_4_;
              auVar171._28_4_ = 0;
              auVar18 = vfmsub231ps_fma(auVar171,auVar183,auVar120);
              auVar83._4_4_ = auVar183._4_4_ * auVar108._4_4_;
              auVar83._0_4_ = auVar183._0_4_ * auVar108._0_4_;
              auVar83._8_4_ = auVar183._8_4_ * auVar108._8_4_;
              auVar83._12_4_ = auVar183._12_4_ * auVar108._12_4_;
              auVar83._16_4_ = auVar183._16_4_ * auVar108._16_4_;
              auVar83._20_4_ = auVar183._20_4_ * auVar108._20_4_;
              auVar83._24_4_ = auVar183._24_4_ * auVar108._24_4_;
              auVar83._28_4_ = auVar108._28_4_;
              auVar163 = vfmsub231ps_fma(auVar83,auVar134,auVar26);
              auVar14 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar18),ZEXT1632(auVar163));
              auVar17 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT1632(auVar106),ZEXT832(0) << 0x20);
              auVar170 = vrcpps_avx(ZEXT1632(auVar17));
              auVar199._8_4_ = 0x3f800000;
              auVar199._0_8_ = &DAT_3f8000003f800000;
              auVar199._12_4_ = 0x3f800000;
              auVar199._16_4_ = 0x3f800000;
              auVar199._20_4_ = 0x3f800000;
              auVar199._24_4_ = 0x3f800000;
              auVar199._28_4_ = 0x3f800000;
              auVar200 = ZEXT3264(auVar199);
              auVar14 = vfnmadd213ps_fma(auVar170,ZEXT1632(auVar17),auVar199);
              auVar14 = vfmadd132ps_fma(ZEXT1632(auVar14),auVar170,auVar170);
              auVar142._0_4_ = auVar163._0_4_ * local_760._0_4_;
              auVar142._4_4_ = auVar163._4_4_ * local_760._4_4_;
              auVar142._8_4_ = auVar163._8_4_ * local_760._8_4_;
              auVar142._12_4_ = auVar163._12_4_ * local_760._12_4_;
              auVar142._16_4_ = local_760._16_4_ * 0.0;
              auVar142._20_4_ = local_760._20_4_ * 0.0;
              auVar142._24_4_ = local_760._24_4_ * 0.0;
              auVar142._28_4_ = 0;
              auVar18 = vfmadd231ps_fma(auVar142,ZEXT1632(auVar18),auVar25);
              auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar148,ZEXT1632(auVar106));
              fVar117 = auVar14._0_4_;
              fVar157 = auVar14._4_4_;
              fVar158 = auVar14._8_4_;
              fVar159 = auVar14._12_4_;
              auVar114 = ZEXT1632(CONCAT412(fVar159 * auVar18._12_4_,
                                            CONCAT48(fVar158 * auVar18._8_4_,
                                                     CONCAT44(fVar157 * auVar18._4_4_,
                                                              fVar117 * auVar18._0_4_))));
              auVar156 = ZEXT3264(auVar114);
              fVar129 = local_7a8->tfar;
              auVar143._4_4_ = fVar129;
              auVar143._0_4_ = fVar129;
              auVar143._8_4_ = fVar129;
              auVar143._12_4_ = fVar129;
              auVar143._16_4_ = fVar129;
              auVar143._20_4_ = fVar129;
              auVar143._24_4_ = fVar129;
              auVar143._28_4_ = fVar129;
              auVar93._4_4_ = uStack_11c;
              auVar93._0_4_ = local_120;
              auVar93._8_4_ = uStack_118;
              auVar93._12_4_ = uStack_114;
              auVar93._16_4_ = uStack_110;
              auVar93._20_4_ = uStack_10c;
              auVar93._24_4_ = uStack_108;
              auVar93._28_4_ = uStack_104;
              auVar148 = vcmpps_avx(auVar93,auVar114,2);
              auVar170 = vcmpps_avx(auVar114,auVar143,2);
              auVar148 = vandps_avx(auVar170,auVar148);
              auVar14 = vpackssdw_avx(auVar148._0_16_,auVar148._16_16_);
              auVar24 = vpand_avx(auVar24,auVar14);
              auVar148 = vpmovsxwd_avx2(auVar24);
              if ((((((((auVar148 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar148 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar148 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar148 >> 0x7f,0) == '\0') &&
                    (auVar148 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar148 >> 0xbf,0) == '\0') &&
                  (auVar148 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar148[0x1f]) goto LAB_018d0dc2;
              auVar148 = vcmpps_avx(ZEXT1632(auVar17),ZEXT832(0) << 0x20,4);
              auVar14 = vpackssdw_avx(auVar148._0_16_,auVar148._16_16_);
              auVar24 = vpand_avx(auVar24,auVar14);
              auVar148 = vpmovsxwd_avx2(auVar24);
              auVar144._8_8_ = uStack_458;
              auVar144._0_8_ = local_460;
              auVar144._16_8_ = uStack_450;
              auVar144._24_8_ = uStack_448;
              if ((((((((auVar148 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar148 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar148 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar148 >> 0x7f,0) != '\0') ||
                    (auVar148 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar148 >> 0xbf,0) != '\0') ||
                  (auVar148 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar148[0x1f] < '\0') {
                auVar125 = ZEXT1632(CONCAT412(fVar159 * auVar15._12_4_,
                                              CONCAT48(fVar158 * auVar15._8_4_,
                                                       CONCAT44(fVar157 * auVar15._4_4_,
                                                                fVar117 * auVar15._0_4_))));
                auVar84._28_4_ = SUB84(uStack_448,4);
                auVar84._0_28_ =
                     ZEXT1628(CONCAT412(fVar159 * auVar16._12_4_,
                                        CONCAT48(fVar158 * auVar16._8_4_,
                                                 CONCAT44(fVar157 * auVar16._4_4_,
                                                          fVar117 * auVar16._0_4_))));
                auVar177._8_4_ = 0x3f800000;
                auVar177._0_8_ = &DAT_3f8000003f800000;
                auVar177._12_4_ = 0x3f800000;
                auVar177._16_4_ = 0x3f800000;
                auVar177._20_4_ = 0x3f800000;
                auVar177._24_4_ = 0x3f800000;
                auVar177._28_4_ = 0x3f800000;
                auVar170 = vsubps_avx(auVar177,auVar125);
                _local_1c0 = vblendvps_avx(auVar170,auVar125,auVar119);
                auVar170 = vsubps_avx(auVar177,auVar84);
                local_3a0 = vblendvps_avx(auVar170,auVar84,auVar119);
                local_1e0 = auVar114;
                auVar144 = auVar148;
              }
            }
            auVar213 = ZEXT3264(local_6e0);
            auVar209 = ZEXT3264(local_720);
            auVar92._4_4_ = fStack_51c;
            auVar92._0_4_ = local_520;
            auVar92._8_4_ = fStack_518;
            auVar92._12_4_ = fStack_514;
            auVar92._16_4_ = fStack_510;
            auVar92._20_4_ = fStack_50c;
            auVar92._24_4_ = fStack_508;
            auVar92._28_4_ = fStack_504;
            if ((((((((auVar144 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar144 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar144 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar144 >> 0x7f,0) != '\0') ||
                  (auVar144 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar144 >> 0xbf,0) != '\0') ||
                (auVar144 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar144[0x1f] < '\0') {
              auVar148 = vsubps_avx(auVar135,_local_440);
              auVar24 = vfmadd213ps_fma(auVar148,_local_1c0,_local_440);
              fVar129 = local_730->depth_scale;
              auVar85._4_4_ = (auVar24._4_4_ + auVar24._4_4_) * fVar129;
              auVar85._0_4_ = (auVar24._0_4_ + auVar24._0_4_) * fVar129;
              auVar85._8_4_ = (auVar24._8_4_ + auVar24._8_4_) * fVar129;
              auVar85._12_4_ = (auVar24._12_4_ + auVar24._12_4_) * fVar129;
              auVar85._16_4_ = fVar129 * 0.0;
              auVar85._20_4_ = fVar129 * 0.0;
              auVar85._24_4_ = fVar129 * 0.0;
              auVar85._28_4_ = fVar129;
              auVar156 = ZEXT3264(local_1e0);
              auVar148 = vcmpps_avx(local_1e0,auVar85,6);
              auVar170 = auVar144 & auVar148;
              auVar178 = ZEXT3264(local_620);
              if ((((((((auVar170 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar170 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar170 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar170 >> 0x7f,0) != '\0') ||
                    (auVar170 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar170 >> 0xbf,0) != '\0') ||
                  (auVar170 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar170[0x1f] < '\0') {
                local_260 = vandps_avx(auVar148,auVar144);
                auVar127._8_4_ = 0xbf800000;
                auVar127._0_8_ = 0xbf800000bf800000;
                auVar127._12_4_ = 0xbf800000;
                auVar127._16_4_ = 0xbf800000;
                auVar127._20_4_ = 0xbf800000;
                auVar127._24_4_ = 0xbf800000;
                auVar127._28_4_ = 0xbf800000;
                auVar139._8_4_ = 0x40000000;
                auVar139._0_8_ = 0x4000000040000000;
                auVar139._12_4_ = 0x40000000;
                auVar139._16_4_ = 0x40000000;
                auVar139._20_4_ = 0x40000000;
                auVar139._24_4_ = 0x40000000;
                auVar139._28_4_ = 0x40000000;
                auVar24 = vfmadd213ps_fma(local_3a0,auVar139,auVar127);
                local_320 = _local_1c0;
                local_300 = ZEXT1632(auVar24);
                local_2e0 = local_1e0;
                local_2bc = iVar20;
                local_2b0 = local_6a0;
                uStack_2a8 = uStack_698;
                local_2a0 = local_4d0;
                uStack_298 = uStack_4c8;
                local_290 = local_4e0;
                uStack_288 = uStack_4d8;
                local_280 = local_4f0;
                uStack_278 = uStack_4e8;
                pGVar21 = (local_7b0->scene->geometries).items[local_728].ptr;
                auVar184 = ZEXT3264(auVar92);
                local_3a0 = ZEXT1632(auVar24);
                auVar148 = local_3a0;
                if ((pGVar21->mask & local_7a8->mask) == 0) {
                  bVar96 = 0;
                  auVar128 = ZEXT3264(local_640);
                  auVar174 = ZEXT3264(local_700);
                }
                else {
                  auVar128 = ZEXT3264(local_640);
                  if (local_7b0->args->filter == (RTCFilterFunctionN)0x0) {
                    auVar174 = ZEXT3264(local_700);
                    bVar96 = 1;
                    if (pGVar21->occlusionFilterN == (RTCFilterFunctionN)0x0) goto LAB_018d0db1;
                  }
                  local_660 = ZEXT1632(CONCAT88(auVar13._8_8_,pGVar21));
                  local_780._4_28_ = auVar25._4_28_;
                  local_780._0_4_ = (int)uVar100;
                  auVar205 = ZEXT864(0);
                  fVar129 = (float)local_2c0;
                  local_240[0] = (fVar129 + (float)local_1c0._0_4_ + 0.0) * local_140;
                  local_240[1] = (fVar129 + (float)local_1c0._4_4_ + 1.0) * fStack_13c;
                  local_240[2] = (fVar129 + fStack_1b8 + 2.0) * fStack_138;
                  local_240[3] = (fVar129 + fStack_1b4 + 3.0) * fStack_134;
                  fStack_230 = (fVar129 + fStack_1b0 + 4.0) * fStack_130;
                  fStack_22c = (fVar129 + fStack_1ac + 5.0) * fStack_12c;
                  fStack_228 = (fVar129 + fStack_1a8 + 6.0) * fStack_128;
                  fStack_224 = fVar129 + fStack_1a4 + 7.0;
                  local_3a0._0_8_ = auVar24._0_8_;
                  local_3a0._8_8_ = auVar24._8_8_;
                  local_220 = local_3a0._0_8_;
                  uStack_218 = local_3a0._8_8_;
                  uStack_210 = 0;
                  uStack_208 = 0;
                  local_200 = local_1e0;
                  uVar97 = vmovmskps_avx(local_260);
                  local_5a0 = ZEXT1632(CONCAT124(auVar12._4_12_,
                                                 (int)CONCAT71((int7)((ulong)pGVar21 >> 8),
                                                               uVar97 != 0)));
                  local_3a0 = auVar148;
                  if (uVar97 != 0) {
                    uVar98 = (ulong)(uVar97 & 0xff);
                    _local_7a0 = ZEXT1632(CONCAT88(auVar11._8_8_,uVar98));
                    lVar28 = 0;
                    for (; (uVar98 & 1) == 0; uVar98 = uVar98 >> 1 | 0x8000000000000000) {
                      lVar28 = lVar28 + 1;
                    }
                    local_760._0_8_ = lVar28;
                    local_540._0_16_ = CONCAT88(uStack_4c8,local_4d0);
                    local_540 = ZEXT1632(local_540._0_16_);
                    local_480._0_16_ = CONCAT88(uStack_4d8,local_4e0);
                    local_480 = ZEXT1632(local_480._0_16_);
                    _local_560 = ZEXT1632(CONCAT88(uStack_4e8,local_4f0));
                    do {
                      local_5d4 = local_240[local_760._0_8_];
                      local_5d0 = *(undefined4 *)((long)&local_220 + local_760._0_8_ * 4);
                      local_4a0._0_4_ = local_7a8->tfar;
                      local_7a8->tfar = *(float *)(local_200 + local_760._0_8_ * 4);
                      local_690.context = local_7b0->user;
                      fVar117 = 1.0 - local_5d4;
                      fVar129 = fVar117 * fVar117 * -3.0;
                      auVar24 = vfmadd231ss_fma(ZEXT416((uint)(fVar117 * fVar117)),
                                                ZEXT416((uint)(local_5d4 * fVar117)),
                                                ZEXT416(0xc0000000));
                      auVar11 = vfmsub132ss_fma(ZEXT416((uint)(local_5d4 * fVar117)),
                                                ZEXT416((uint)(local_5d4 * local_5d4)),
                                                ZEXT416(0x40000000));
                      fVar117 = auVar24._0_4_ * 3.0;
                      fVar157 = auVar11._0_4_ * 3.0;
                      fVar158 = local_5d4 * local_5d4 * 3.0;
                      auVar151._0_4_ = fVar158 * (float)local_560._0_4_;
                      auVar151._4_4_ = fVar158 * (float)local_560._4_4_;
                      auVar151._8_4_ = fVar158 * (float)uStack_558;
                      auVar151._12_4_ = fVar158 * uStack_558._4_4_;
                      auVar156 = ZEXT1664(auVar151);
                      auVar132._4_4_ = fVar157;
                      auVar132._0_4_ = fVar157;
                      auVar132._8_4_ = fVar157;
                      auVar132._12_4_ = fVar157;
                      auVar24 = vfmadd132ps_fma(auVar132,auVar151,local_480._0_16_);
                      auVar141._4_4_ = fVar117;
                      auVar141._0_4_ = fVar117;
                      auVar141._8_4_ = fVar117;
                      auVar141._12_4_ = fVar117;
                      auVar24 = vfmadd132ps_fma(auVar141,auVar24,local_540._0_16_);
                      auVar133._4_4_ = fVar129;
                      auVar133._0_4_ = fVar129;
                      auVar133._8_4_ = fVar129;
                      auVar133._12_4_ = fVar129;
                      auVar91._8_8_ = uStack_698;
                      auVar91._0_8_ = local_6a0;
                      auVar24 = vfmadd132ps_fma(auVar133,auVar24,auVar91);
                      local_5e0 = vmovlps_avx(auVar24);
                      local_5d8 = vextractps_avx(auVar24,2);
                      local_5cc = (int)local_5a8;
                      local_5c8 = (int)local_728;
                      local_5c4 = (local_690.context)->instID[0];
                      local_5c0 = (local_690.context)->instPrimID[0];
                      local_7b4 = -1;
                      local_690.valid = &local_7b4;
                      local_690.geometryUserPtr = *(void **)(local_660._0_8_ + 0x18);
                      local_690.ray = (RTCRayN *)local_7a8;
                      local_690.hit = (RTCHitN *)&local_5e0;
                      local_690.N = 1;
                      if (*(code **)(local_660._0_8_ + 0x48) == (code *)0x0) {
LAB_018d0cb4:
                        p_Var23 = local_7b0->args->filter;
                        if (p_Var23 == (RTCFilterFunctionN)0x0) break;
                        if (((local_7b0->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           ((*(byte *)(local_660._0_8_ + 0x3e) & 0x40) != 0)) {
                          auVar156 = ZEXT1664(auVar156._0_16_);
                          auVar200 = ZEXT1664(auVar200._0_16_);
                          auVar205 = ZEXT1664(auVar205._0_16_);
                          (*p_Var23)(&local_690);
                        }
                        if (*local_690.valid != 0) break;
                      }
                      else {
                        auVar156 = ZEXT1664(auVar151);
                        auVar200 = ZEXT1664(auVar200._0_16_);
                        auVar205 = ZEXT1664(auVar205._0_16_);
                        (**(code **)(local_660._0_8_ + 0x48))(&local_690);
                        if (*local_690.valid != 0) goto LAB_018d0cb4;
                      }
                      local_7a8->tfar = (float)local_4a0._0_4_;
                      uVar100 = (ulong)local_7a0 ^ 1L << (local_760._0_8_ & 0x3f);
                      local_7a0 = (undefined1  [8])uVar100;
                      lVar28 = 0;
                      for (uVar98 = uVar100; (uVar98 & 1) == 0;
                          uVar98 = uVar98 >> 1 | 0x8000000000000000) {
                        lVar28 = lVar28 + 1;
                      }
                      local_760._0_8_ = lVar28;
                      local_5a0._0_4_ = (int)CONCAT71((int7)((ulong)lVar28 >> 8),uVar100 != 0);
                    } while (uVar100 != 0);
                  }
                  bVar96 = local_5a0[0] & 1;
                  auVar174 = ZEXT3264(local_700);
                  auVar128 = ZEXT3264(local_640);
                  auVar178 = ZEXT3264(local_620);
                  auVar184 = ZEXT3264(CONCAT428(fStack_504,
                                                CONCAT424(fStack_508,
                                                          CONCAT420(fStack_50c,
                                                                    CONCAT416(fStack_510,
                                                                              CONCAT412(fStack_514,
                                                                                        CONCAT48(
                                                  fStack_518,CONCAT44(fStack_51c,local_520))))))));
                  auVar209 = ZEXT3264(local_720);
                  auVar213 = ZEXT3264(local_6e0);
                  uVar100 = (ulong)(uint)local_780._0_4_;
                }
LAB_018d0db1:
                uVar100 = CONCAT71((int7)(uVar100 >> 8),(byte)uVar100 | bVar96);
                auVar145 = ZEXT3264(local_6c0);
                goto LAB_018d093e;
              }
            }
            auVar178 = ZEXT3264(local_620);
            auVar145 = ZEXT3264(local_6c0);
            auVar128 = ZEXT3264(local_640);
            auVar184 = ZEXT3264(auVar92);
            auVar174 = ZEXT3264(local_700);
          }
LAB_018d093e:
          lVar103 = lVar103 + 8;
        } while ((int)lVar103 < iVar20);
      }
      if ((uVar100 & 1) != 0) {
        return local_7b5;
      }
      fVar129 = local_7a8->tfar;
      auVar115._4_4_ = fVar129;
      auVar115._0_4_ = fVar129;
      auVar115._8_4_ = fVar129;
      auVar115._12_4_ = fVar129;
      auVar115._16_4_ = fVar129;
      auVar115._20_4_ = fVar129;
      auVar115._24_4_ = fVar129;
      auVar115._28_4_ = fVar129;
      auVar148 = vcmpps_avx(local_80,auVar115,2);
      uVar97 = vmovmskps_avx(auVar148);
      uVar97 = (uint)uVar102 & uVar97;
      local_7b5 = uVar97 != 0;
      ray = local_7a8;
      context = local_7b0;
      pre = local_730;
    } while (local_7b5);
  }
  return local_7b5;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));
         
          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }